

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [32];
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  int iVar86;
  ulong uVar87;
  undefined1 auVar95 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar88;
  ulong uVar89;
  long lVar90;
  Geometry *pGVar91;
  byte bVar92;
  float fVar93;
  float fVar94;
  float fVar145;
  float fVar146;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar102 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar148;
  float fVar151;
  float fVar152;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar153;
  undefined4 uVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar165;
  float fVar166;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar178;
  float fVar192;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [64];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  RTCFilterFunctionNArguments args;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  RTCFilterFunctionNArguments local_678;
  undefined1 (*local_648) [32];
  undefined1 local_640 [32];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  int local_33c;
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar227 [32];
  
  PVar13 = prim[1];
  uVar87 = (ulong)(byte)PVar13;
  fVar171 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar99 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar186 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  fVar177 = fVar171 * auVar186._0_4_;
  fVar153 = fVar171 * auVar99._0_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar87 * 4 + 6);
  auVar108 = vpmovsxbd_avx2(auVar95);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar87 * 5 + 6);
  auVar106 = vpmovsxbd_avx2(auVar100);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar87 * 6 + 6);
  auVar119 = vpmovsxbd_avx2(auVar101);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar155);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar112 = vpmovsxbd_avx2(auVar8);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar109 = vcvtdq2ps_avx(auVar112);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar87 + 6);
  auVar107 = vpmovsxbd_avx2(auVar9);
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar89 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar110 = vpmovsxbd_avx2(auVar10);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar89 + uVar87 + 6);
  auVar117 = vpmovsxbd_avx2(auVar11);
  auVar117 = vcvtdq2ps_avx(auVar117);
  uVar83 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar105 = vpmovsxbd_avx2(auVar12);
  auVar111 = vcvtdq2ps_avx(auVar105);
  auVar223._4_4_ = fVar153;
  auVar223._0_4_ = fVar153;
  auVar223._8_4_ = fVar153;
  auVar223._12_4_ = fVar153;
  auVar223._16_4_ = fVar153;
  auVar223._20_4_ = fVar153;
  auVar223._24_4_ = fVar153;
  auVar223._28_4_ = fVar153;
  auVar225._8_4_ = 1;
  auVar225._0_8_ = 0x100000001;
  auVar225._12_4_ = 1;
  auVar225._16_4_ = 1;
  auVar225._20_4_ = 1;
  auVar225._24_4_ = 1;
  auVar225._28_4_ = 1;
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = ZEXT1632(CONCAT412(fVar171 * auVar99._12_4_,
                                CONCAT48(fVar171 * auVar99._8_4_,
                                         CONCAT44(fVar171 * auVar99._4_4_,fVar153))));
  auVar113 = vpermps_avx2(auVar225,auVar114);
  auVar104 = vpermps_avx512vl(auVar103,auVar114);
  fVar153 = auVar104._0_4_;
  fVar165 = auVar104._4_4_;
  auVar114._4_4_ = fVar165 * auVar119._4_4_;
  auVar114._0_4_ = fVar153 * auVar119._0_4_;
  fVar166 = auVar104._8_4_;
  auVar114._8_4_ = fVar166 * auVar119._8_4_;
  fVar178 = auVar104._12_4_;
  auVar114._12_4_ = fVar178 * auVar119._12_4_;
  fVar192 = auVar104._16_4_;
  auVar114._16_4_ = fVar192 * auVar119._16_4_;
  fVar93 = auVar104._20_4_;
  auVar114._20_4_ = fVar93 * auVar119._20_4_;
  fVar94 = auVar104._24_4_;
  auVar114._24_4_ = fVar94 * auVar119._24_4_;
  auVar114._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar107._4_4_ * fVar165;
  auVar112._0_4_ = auVar107._0_4_ * fVar153;
  auVar112._8_4_ = auVar107._8_4_ * fVar166;
  auVar112._12_4_ = auVar107._12_4_ * fVar178;
  auVar112._16_4_ = auVar107._16_4_ * fVar192;
  auVar112._20_4_ = auVar107._20_4_ * fVar93;
  auVar112._24_4_ = auVar107._24_4_ * fVar94;
  auVar112._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar111._4_4_ * fVar165;
  auVar105._0_4_ = auVar111._0_4_ * fVar153;
  auVar105._8_4_ = auVar111._8_4_ * fVar166;
  auVar105._12_4_ = auVar111._12_4_ * fVar178;
  auVar105._16_4_ = auVar111._16_4_ * fVar192;
  auVar105._20_4_ = auVar111._20_4_ * fVar93;
  auVar105._24_4_ = auVar111._24_4_ * fVar94;
  auVar105._28_4_ = auVar104._28_4_;
  auVar95 = vfmadd231ps_fma(auVar114,auVar113,auVar106);
  auVar100 = vfmadd231ps_fma(auVar112,auVar113,auVar109);
  auVar101 = vfmadd231ps_fma(auVar105,auVar117,auVar113);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar223,auVar108);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar223,auVar118);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar110,auVar223);
  auVar224._4_4_ = fVar177;
  auVar224._0_4_ = fVar177;
  auVar224._8_4_ = fVar177;
  auVar224._12_4_ = fVar177;
  auVar224._16_4_ = fVar177;
  auVar224._20_4_ = fVar177;
  auVar224._24_4_ = fVar177;
  auVar224._28_4_ = fVar177;
  auVar105 = ZEXT1632(CONCAT412(fVar171 * auVar186._12_4_,
                                CONCAT48(fVar171 * auVar186._8_4_,
                                         CONCAT44(fVar171 * auVar186._4_4_,fVar177))));
  auVar112 = vpermps_avx2(auVar225,auVar105);
  auVar105 = vpermps_avx512vl(auVar103,auVar105);
  fVar171 = auVar105._0_4_;
  fVar153 = auVar105._4_4_;
  auVar113._4_4_ = fVar153 * auVar119._4_4_;
  auVar113._0_4_ = fVar171 * auVar119._0_4_;
  fVar165 = auVar105._8_4_;
  auVar113._8_4_ = fVar165 * auVar119._8_4_;
  fVar166 = auVar105._12_4_;
  auVar113._12_4_ = fVar166 * auVar119._12_4_;
  fVar178 = auVar105._16_4_;
  auVar113._16_4_ = fVar178 * auVar119._16_4_;
  fVar192 = auVar105._20_4_;
  auVar113._20_4_ = fVar192 * auVar119._20_4_;
  fVar93 = auVar105._24_4_;
  auVar113._24_4_ = fVar93 * auVar119._24_4_;
  auVar113._28_4_ = 1;
  auVar103._4_4_ = auVar107._4_4_ * fVar153;
  auVar103._0_4_ = auVar107._0_4_ * fVar171;
  auVar103._8_4_ = auVar107._8_4_ * fVar165;
  auVar103._12_4_ = auVar107._12_4_ * fVar166;
  auVar103._16_4_ = auVar107._16_4_ * fVar178;
  auVar103._20_4_ = auVar107._20_4_ * fVar192;
  auVar103._24_4_ = auVar107._24_4_ * fVar93;
  auVar103._28_4_ = auVar119._28_4_;
  auVar107._4_4_ = auVar111._4_4_ * fVar153;
  auVar107._0_4_ = auVar111._0_4_ * fVar171;
  auVar107._8_4_ = auVar111._8_4_ * fVar165;
  auVar107._12_4_ = auVar111._12_4_ * fVar166;
  auVar107._16_4_ = auVar111._16_4_ * fVar178;
  auVar107._20_4_ = auVar111._20_4_ * fVar192;
  auVar107._24_4_ = auVar111._24_4_ * fVar93;
  auVar107._28_4_ = auVar105._28_4_;
  auVar155 = vfmadd231ps_fma(auVar113,auVar112,auVar106);
  auVar8 = vfmadd231ps_fma(auVar103,auVar112,auVar109);
  auVar9 = vfmadd231ps_fma(auVar107,auVar112,auVar117);
  auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar224,auVar108);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar224,auVar118);
  auVar212._8_4_ = 0x7fffffff;
  auVar212._0_8_ = 0x7fffffff7fffffff;
  auVar212._12_4_ = 0x7fffffff;
  auVar212._16_4_ = 0x7fffffff;
  auVar212._20_4_ = 0x7fffffff;
  auVar212._24_4_ = 0x7fffffff;
  auVar212._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar224,auVar110);
  auVar108 = vandps_avx(ZEXT1632(auVar95),auVar212);
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar210._16_4_ = 0x219392ef;
  auVar210._20_4_ = 0x219392ef;
  auVar210._24_4_ = 0x219392ef;
  auVar210._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar108,auVar210,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar104._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar108 = vandps_avx(ZEXT1632(auVar100),auVar212);
  uVar89 = vcmpps_avx512vl(auVar108,auVar210,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar115._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar100._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar100._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar100._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar100._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar108 = vandps_avx(ZEXT1632(auVar101),auVar212);
  uVar89 = vcmpps_avx512vl(auVar108,auVar210,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar108._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar101._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar106 = vrcp14ps_avx512vl(auVar104);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = 0x3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar211._16_4_ = 0x3f800000;
  auVar211._20_4_ = 0x3f800000;
  auVar211._24_4_ = 0x3f800000;
  auVar211._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar104,auVar106,auVar211);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar115);
  auVar100 = vfnmadd213ps_fma(auVar115,auVar106,auVar211);
  auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar106,auVar106);
  auVar106 = vrcp14ps_avx512vl(auVar108);
  auVar101 = vfnmadd213ps_fma(auVar108,auVar106,auVar211);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar106,auVar106);
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 7 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar155));
  auVar110._4_4_ = auVar95._4_4_ * auVar108._4_4_;
  auVar110._0_4_ = auVar95._0_4_ * auVar108._0_4_;
  auVar110._8_4_ = auVar95._8_4_ * auVar108._8_4_;
  auVar110._12_4_ = auVar95._12_4_ * auVar108._12_4_;
  auVar110._16_4_ = auVar108._16_4_ * 0.0;
  auVar110._20_4_ = auVar108._20_4_ * 0.0;
  auVar110._24_4_ = auVar108._24_4_ * 0.0;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 9 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar155));
  auVar107 = vpbroadcastd_avx512vl();
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar174._0_4_ = auVar95._0_4_ * auVar108._0_4_;
  auVar174._4_4_ = auVar95._4_4_ * auVar108._4_4_;
  auVar174._8_4_ = auVar95._8_4_ * auVar108._8_4_;
  auVar174._12_4_ = auVar95._12_4_ * auVar108._12_4_;
  auVar174._16_4_ = auVar108._16_4_ * 0.0;
  auVar174._20_4_ = auVar108._20_4_ * 0.0;
  auVar174._24_4_ = auVar108._24_4_ * 0.0;
  auVar174._28_4_ = 0;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar13 * 0x10 + uVar87 * -2 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar8));
  auVar117._4_4_ = auVar100._4_4_ * auVar108._4_4_;
  auVar117._0_4_ = auVar100._0_4_ * auVar108._0_4_;
  auVar117._8_4_ = auVar100._8_4_ * auVar108._8_4_;
  auVar117._12_4_ = auVar100._12_4_ * auVar108._12_4_;
  auVar117._16_4_ = auVar108._16_4_ * 0.0;
  auVar117._20_4_ = auVar108._20_4_ * 0.0;
  auVar117._24_4_ = auVar108._24_4_ * 0.0;
  auVar117._28_4_ = auVar108._28_4_;
  auVar108 = vcvtdq2ps_avx(auVar106);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar8));
  auVar169._0_4_ = auVar100._0_4_ * auVar108._0_4_;
  auVar169._4_4_ = auVar100._4_4_ * auVar108._4_4_;
  auVar169._8_4_ = auVar100._8_4_ * auVar108._8_4_;
  auVar169._12_4_ = auVar100._12_4_ * auVar108._12_4_;
  auVar169._16_4_ = auVar108._16_4_ * 0.0;
  auVar169._20_4_ = auVar108._20_4_ * 0.0;
  auVar169._24_4_ = auVar108._24_4_ * 0.0;
  auVar169._28_4_ = 0;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar87 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar9));
  auVar111._4_4_ = auVar108._4_4_ * auVar101._4_4_;
  auVar111._0_4_ = auVar108._0_4_ * auVar101._0_4_;
  auVar111._8_4_ = auVar108._8_4_ * auVar101._8_4_;
  auVar111._12_4_ = auVar108._12_4_ * auVar101._12_4_;
  auVar111._16_4_ = auVar108._16_4_ * 0.0;
  auVar111._20_4_ = auVar108._20_4_ * 0.0;
  auVar111._24_4_ = auVar108._24_4_ * 0.0;
  auVar111._28_4_ = auVar108._28_4_;
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x17 + 6));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar108 = vsubps_avx(auVar108,ZEXT1632(auVar9));
  auVar116._0_4_ = auVar101._0_4_ * auVar108._0_4_;
  auVar116._4_4_ = auVar101._4_4_ * auVar108._4_4_;
  auVar116._8_4_ = auVar101._8_4_ * auVar108._8_4_;
  auVar116._12_4_ = auVar101._12_4_ * auVar108._12_4_;
  auVar116._16_4_ = auVar108._16_4_ * 0.0;
  auVar116._20_4_ = auVar108._20_4_ * 0.0;
  auVar116._24_4_ = auVar108._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar108 = vpminsd_avx2(auVar110,auVar174);
  auVar106 = vpminsd_avx2(auVar117,auVar169);
  auVar108 = vmaxps_avx(auVar108,auVar106);
  auVar106 = vpminsd_avx2(auVar111,auVar116);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar119._4_4_ = uVar154;
  auVar119._0_4_ = uVar154;
  auVar119._8_4_ = uVar154;
  auVar119._12_4_ = uVar154;
  auVar119._16_4_ = uVar154;
  auVar119._20_4_ = uVar154;
  auVar119._24_4_ = uVar154;
  auVar119._28_4_ = uVar154;
  auVar106 = vmaxps_avx512vl(auVar106,auVar119);
  auVar108 = vmaxps_avx(auVar108,auVar106);
  auVar106._8_4_ = 0x3f7ffffa;
  auVar106._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar106._12_4_ = 0x3f7ffffa;
  auVar106._16_4_ = 0x3f7ffffa;
  auVar106._20_4_ = 0x3f7ffffa;
  auVar106._24_4_ = 0x3f7ffffa;
  auVar106._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar108,auVar106);
  auVar108 = vpmaxsd_avx2(auVar110,auVar174);
  auVar106 = vpmaxsd_avx2(auVar117,auVar169);
  auVar108 = vminps_avx(auVar108,auVar106);
  auVar106 = vpmaxsd_avx2(auVar111,auVar116);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar118._4_4_ = uVar154;
  auVar118._0_4_ = uVar154;
  auVar118._8_4_ = uVar154;
  auVar118._12_4_ = uVar154;
  auVar118._16_4_ = uVar154;
  auVar118._20_4_ = uVar154;
  auVar118._24_4_ = uVar154;
  auVar118._28_4_ = uVar154;
  auVar106 = vminps_avx512vl(auVar106,auVar118);
  auVar108 = vminps_avx(auVar108,auVar106);
  auVar109._8_4_ = 0x3f800003;
  auVar109._0_8_ = 0x3f8000033f800003;
  auVar109._12_4_ = 0x3f800003;
  auVar109._16_4_ = 0x3f800003;
  auVar109._20_4_ = 0x3f800003;
  auVar109._24_4_ = 0x3f800003;
  auVar109._28_4_ = 0x3f800003;
  auVar108 = vmulps_avx512vl(auVar108,auVar109);
  uVar28 = vpcmpgtd_avx512vl(auVar107,_DAT_01fe9900);
  uVar24 = vcmpps_avx512vl(local_80,auVar108,2);
  if ((byte)((byte)uVar24 & (byte)uVar28) != 0) {
    uVar89 = (ulong)(byte)((byte)uVar24 & (byte)uVar28);
    local_648 = (undefined1 (*) [32])&local_160;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar233 = ZEXT1664(auVar95);
    do {
      lVar29 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar88 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar29 * 4 + 6);
      pGVar91 = (context->scene->geometries).items[uVar88].ptr;
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar91->field_0x58 +
                               pGVar91[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar14);
      p_Var16 = pGVar91[1].intersectionFilterN;
      lVar29 = *(long *)&pGVar91[1].time_range.upper;
      auVar95 = *(undefined1 (*) [16])(lVar29 + (long)p_Var16 * uVar83);
      pauVar3 = (undefined1 (*) [16])(lVar29 + (uVar83 + 1) * (long)p_Var16);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar28 = *(undefined8 *)(*pauVar3 + 8);
      auVar12 = *pauVar3;
      auVar10 = *pauVar3;
      auVar8 = *pauVar3;
      auVar100 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar29 + (uVar83 + 2) * (long)p_Var16);
      uVar77 = *(undefined8 *)*pauVar4;
      uVar78 = *(undefined8 *)(*pauVar4 + 8);
      auVar11 = *pauVar4;
      auVar9 = *pauVar4;
      auVar155 = *pauVar4;
      auVar101 = *pauVar4;
      uVar89 = uVar89 - 1 & uVar89;
      pauVar5 = (undefined1 (*) [12])(lVar29 + (uVar83 + 3) * (long)p_Var16);
      uVar79 = *(undefined8 *)*pauVar5;
      uVar80 = *(undefined8 *)(*pauVar5 + 8);
      local_6c0 = (float)uVar79;
      fStack_6bc = (float)((ulong)uVar79 >> 0x20);
      fStack_6b8 = (float)uVar80;
      fStack_6b4 = (float)((ulong)uVar80 >> 0x20);
      if (uVar89 != 0) {
        uVar87 = uVar89 - 1 & uVar89;
        for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar86 = (int)pGVar91[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar168 = vsubps_avx(auVar95,auVar99);
      uVar154 = auVar168._0_4_;
      auVar98._4_4_ = uVar154;
      auVar98._0_4_ = uVar154;
      auVar98._8_4_ = uVar154;
      auVar98._12_4_ = uVar154;
      auVar186 = vshufps_avx(auVar168,auVar168,0x55);
      auVar168 = vshufps_avx(auVar168,auVar168,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar171 = pre->ray_space[k].vz.field_0.m128[0];
      fVar153 = pre->ray_space[k].vz.field_0.m128[1];
      fVar165 = pre->ray_space[k].vz.field_0.m128[2];
      fVar166 = pre->ray_space[k].vz.field_0.m128[3];
      auVar214._0_4_ = fVar171 * auVar168._0_4_;
      auVar214._4_4_ = fVar153 * auVar168._4_4_;
      auVar214._8_4_ = fVar165 * auVar168._8_4_;
      auVar214._12_4_ = fVar166 * auVar168._12_4_;
      auVar186 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar7,auVar186);
      auVar214 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar98);
      auVar186 = vshufps_avx(auVar95,auVar95,0xff);
      auVar98 = vsubps_avx(auVar100,auVar99);
      uVar154 = auVar98._0_4_;
      auVar96._4_4_ = uVar154;
      auVar96._0_4_ = uVar154;
      auVar96._8_4_ = uVar154;
      auVar96._12_4_ = uVar154;
      auVar168 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar215._0_4_ = fVar171 * auVar98._0_4_;
      auVar215._4_4_ = fVar153 * auVar98._4_4_;
      auVar215._8_4_ = fVar165 * auVar98._8_4_;
      auVar215._12_4_ = fVar166 * auVar98._12_4_;
      auVar168 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar168);
      auVar215 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar6,auVar96);
      auVar168 = vshufps_avx(auVar100,auVar100,0xff);
      auVar96 = vsubps_avx512vl(auVar101,auVar99);
      uVar154 = auVar96._0_4_;
      auVar97._4_4_ = uVar154;
      auVar97._0_4_ = uVar154;
      auVar97._8_4_ = uVar154;
      auVar97._12_4_ = uVar154;
      auVar98 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar218._0_4_ = fVar171 * auVar96._0_4_;
      auVar218._4_4_ = fVar153 * auVar96._4_4_;
      auVar218._8_4_ = fVar165 * auVar96._8_4_;
      auVar218._12_4_ = fVar166 * auVar96._12_4_;
      auVar98 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar98);
      auVar96 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar6,auVar97);
      auVar97 = vshufps_avx512vl(auVar101,auVar101,0xff);
      auVar30._12_4_ = fStack_6b4;
      auVar30._0_12_ = *pauVar5;
      auVar98 = vsubps_avx512vl(auVar30,auVar99);
      uVar154 = auVar98._0_4_;
      auVar179._4_4_ = uVar154;
      auVar179._0_4_ = uVar154;
      auVar179._8_4_ = uVar154;
      auVar179._12_4_ = uVar154;
      auVar99 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar220._0_4_ = fVar171 * auVar98._0_4_;
      auVar220._4_4_ = fVar153 * auVar98._4_4_;
      auVar220._8_4_ = fVar165 * auVar98._8_4_;
      auVar220._12_4_ = fVar166 * auVar98._12_4_;
      auVar99 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar7,auVar99);
      auVar98 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar6,auVar179);
      lVar29 = (long)iVar86 * 0x44;
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29);
      auVar99 = vshufps_avx512vl(auVar30,auVar30,0xff);
      uVar154 = auVar214._0_4_;
      local_3c0._4_4_ = uVar154;
      local_3c0._0_4_ = uVar154;
      local_3c0._8_4_ = uVar154;
      local_3c0._12_4_ = uVar154;
      local_3c0._16_4_ = uVar154;
      local_3c0._20_4_ = uVar154;
      local_3c0._24_4_ = uVar154;
      local_3c0._28_4_ = uVar154;
      auVar193._8_4_ = 1;
      auVar193._0_8_ = 0x100000001;
      auVar193._12_4_ = 1;
      auVar193._16_4_ = 1;
      auVar193._20_4_ = 1;
      auVar193._24_4_ = 1;
      auVar193._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar193,ZEXT1632(auVar214));
      local_a0 = vbroadcastsd_avx512vl(auVar186);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x484);
      uVar154 = auVar215._0_4_;
      auVar102._4_4_ = uVar154;
      auVar102._0_4_ = uVar154;
      auVar102._8_4_ = uVar154;
      auVar102._12_4_ = uVar154;
      local_400._16_4_ = uVar154;
      local_400._0_16_ = auVar102;
      local_400._20_4_ = uVar154;
      local_400._24_4_ = uVar154;
      local_400._28_4_ = uVar154;
      local_420 = vpermps_avx512vl(auVar193,ZEXT1632(auVar215));
      local_c0 = vbroadcastsd_avx512vl(auVar168);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x908);
      uVar154 = auVar96._0_4_;
      local_440._4_4_ = uVar154;
      local_440._0_4_ = uVar154;
      local_440._8_4_ = uVar154;
      local_440._12_4_ = uVar154;
      local_440._16_4_ = uVar154;
      local_440._20_4_ = uVar154;
      local_440._24_4_ = uVar154;
      local_440._28_4_ = uVar154;
      local_460 = vpermps_avx512vl(auVar193,ZEXT1632(auVar96));
      local_e0 = vbroadcastsd_avx512vl(auVar97);
      auVar118 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0xd8c);
      fVar153 = auVar98._0_4_;
      local_480._4_4_ = fVar153;
      local_480._0_4_ = fVar153;
      fStack_478 = fVar153;
      fStack_474 = fVar153;
      fStack_470 = fVar153;
      fStack_46c = fVar153;
      fStack_468 = fVar153;
      register0x0000139c = fVar153;
      _local_4a0 = vpermps_avx512vl(auVar193,ZEXT1632(auVar98));
      local_100 = vbroadcastsd_avx512vl(auVar99);
      auVar109 = vmulps_avx512vl(_local_480,auVar118);
      auVar107 = vmulps_avx512vl(_local_4a0,auVar118);
      auVar99 = vfmadd231ps_fma(auVar109,auVar119,local_440);
      auVar109 = vfmadd231ps_avx512vl(auVar107,auVar119,local_460);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar106,local_400);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar106,local_420);
      auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar108,local_3c0);
      auVar209 = ZEXT3264(auVar111);
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x484);
      auVar112 = vfmadd231ps_avx512vl(auVar110,auVar108,local_3e0);
      auVar200 = ZEXT3264(auVar112);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x908);
      auVar117 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0xd8c);
      auVar105 = vmulps_avx512vl(_local_480,auVar117);
      auVar113 = vmulps_avx512vl(_local_4a0,auVar117);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_440);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,local_460);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_400);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_420);
      auVar186 = vfmadd231ps_fma(auVar105,auVar109,local_3c0);
      auVar213 = ZEXT1664(auVar186);
      auVar168 = vfmadd231ps_fma(auVar113,auVar109,local_3e0);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar186),auVar111);
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar168),auVar112);
      auVar114 = vmulps_avx512vl(auVar112,auVar105);
      auVar103 = vmulps_avx512vl(auVar111,auVar113);
      auVar114 = vsubps_avx512vl(auVar114,auVar103);
      auVar103 = vmulps_avx512vl(local_100,auVar118);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar119,local_e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_a0);
      auVar104 = vmulps_avx512vl(local_100,auVar117);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,local_e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_a0);
      auVar115 = vmulps_avx512vl(auVar113,auVar113);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar105);
      auVar116 = vmaxps_avx512vl(auVar103,auVar104);
      auVar116 = vmulps_avx512vl(auVar116,auVar116);
      auVar115 = vmulps_avx512vl(auVar116,auVar115);
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      uVar25 = vcmpps_avx512vl(auVar114,auVar115,2);
      auVar99 = vblendps_avx(auVar214,auVar95,8);
      auVar97 = auVar233._0_16_;
      auVar99 = vandps_avx512vl(auVar99,auVar97);
      auVar100 = vblendps_avx(auVar215,auVar100,8);
      auVar100 = vandps_avx512vl(auVar100,auVar97);
      auVar99 = vmaxps_avx(auVar99,auVar100);
      auVar100 = vblendps_avx(auVar96,auVar101,8);
      auVar101 = vandps_avx512vl(auVar100,auVar97);
      auVar100 = vblendps_avx(auVar98,auVar30,8);
      auVar100 = vandps_avx512vl(auVar100,auVar97);
      auVar100 = vmaxps_avx(auVar101,auVar100);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar101 = vmovshdup_avx(auVar100);
      auVar101 = vmaxss_avx(auVar101,auVar100);
      auVar100 = vshufpd_avx(auVar100,auVar100,1);
      auVar100 = vmaxss_avx(auVar100,auVar101);
      auVar101 = vcvtsi2ss_avx512f(auVar97,iVar86);
      local_500._0_16_ = auVar101;
      auVar222._0_4_ = auVar101._0_4_;
      auVar222._4_4_ = auVar222._0_4_;
      auVar222._8_4_ = auVar222._0_4_;
      auVar222._12_4_ = auVar222._0_4_;
      auVar222._16_4_ = auVar222._0_4_;
      auVar222._20_4_ = auVar222._0_4_;
      auVar222._24_4_ = auVar222._0_4_;
      auVar222._28_4_ = auVar222._0_4_;
      uVar26 = vcmpps_avx512vl(auVar222,_DAT_01faff40,0xe);
      bVar92 = (byte)uVar25 & (byte)uVar26;
      fVar171 = auVar100._0_4_ * 4.7683716e-07;
      local_5e0._0_16_ = ZEXT416((uint)fVar171);
      auVar188._8_4_ = 2;
      auVar188._0_8_ = 0x200000002;
      auVar188._12_4_ = 2;
      auVar188._16_4_ = 2;
      auVar188._20_4_ = 2;
      auVar188._24_4_ = 2;
      auVar188._28_4_ = 2;
      local_560 = vpermps_avx512vl(auVar188,ZEXT1632(auVar214));
      auVar232 = ZEXT3264(local_560);
      local_580 = vpermps_avx512vl(auVar188,ZEXT1632(auVar215));
      auVar234 = ZEXT3264(local_580);
      auVar114 = vpermps_avx512vl(auVar188,ZEXT1632(auVar96));
      auVar231 = ZEXT3264(auVar114);
      local_260 = vpermps_avx2(auVar188,ZEXT1632(auVar98));
      local_4e0 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_4dc = 0;
      uStack_4d8 = 0;
      uStack_4d4 = 0;
      if (bVar92 != 0) {
        auVar117 = vmulps_avx512vl(local_260,auVar117);
        auVar110 = vfmadd213ps_avx512vl(auVar110,auVar114,auVar117);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_580,auVar110);
        auVar107 = vfmadd213ps_avx512vl(auVar109,local_560,auVar107);
        auVar118 = vmulps_avx512vl(local_260,auVar118);
        auVar119 = vfmadd213ps_avx512vl(auVar119,auVar114,auVar118);
        auVar110 = vfmadd213ps_avx512vl(auVar106,local_580,auVar119);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1694);
        auVar118 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar29 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar108,local_560,auVar110);
        auVar216._0_4_ = fVar153 * auVar109._0_4_;
        auVar216._4_4_ = fVar153 * auVar109._4_4_;
        auVar216._8_4_ = fVar153 * auVar109._8_4_;
        auVar216._12_4_ = fVar153 * auVar109._12_4_;
        auVar216._16_4_ = fVar153 * auVar109._16_4_;
        auVar216._20_4_ = fVar153 * auVar109._20_4_;
        auVar216._24_4_ = fVar153 * auVar109._24_4_;
        auVar216._28_4_ = 0;
        auVar108 = vmulps_avx512vl(_local_4a0,auVar109);
        auVar109 = vmulps_avx512vl(local_260,auVar109);
        auVar117 = vfmadd231ps_avx512vl(auVar216,auVar118,local_440);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,local_460);
        auVar118 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar118);
        auVar109 = vfmadd231ps_avx512vl(auVar117,auVar119,local_400);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar119,local_420);
        auVar117 = vfmadd231ps_avx512vl(auVar118,local_580,auVar119);
        auVar100 = vfmadd231ps_fma(auVar109,auVar106,local_3c0);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar106,local_3e0);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1b18);
        auVar118 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1f9c);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_560,auVar106);
        auVar38._4_4_ = fVar153 * auVar118._4_4_;
        auVar38._0_4_ = fVar153 * auVar118._0_4_;
        auVar38._8_4_ = fVar153 * auVar118._8_4_;
        auVar38._12_4_ = fVar153 * auVar118._12_4_;
        auVar38._16_4_ = fVar153 * auVar118._16_4_;
        auVar38._20_4_ = fVar153 * auVar118._20_4_;
        auVar38._24_4_ = fVar153 * auVar118._24_4_;
        auVar38._28_4_ = auVar106._28_4_;
        auVar106 = vmulps_avx512vl(_local_4a0,auVar118);
        auVar118 = vmulps_avx512vl(local_260,auVar118);
        auVar115 = vfmadd231ps_avx512vl(auVar38,auVar119,local_440);
        auVar116 = vfmadd231ps_avx512vl(auVar106,auVar119,local_460);
        auVar119 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar119);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar29 + 0x1694);
        auVar118 = vfmadd231ps_avx512vl(auVar115,auVar106,local_400);
        auVar115 = vfmadd231ps_avx512vl(auVar116,auVar106,local_420);
        auVar106 = vfmadd231ps_avx512vl(auVar119,local_580,auVar106);
        auVar101 = vfmadd231ps_fma(auVar118,auVar108,local_3c0);
        auVar119 = vfmadd231ps_avx512vl(auVar115,auVar108,local_3e0);
        auVar118 = vfmadd231ps_avx512vl(auVar106,local_560,auVar108);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar108 = vandps_avx(ZEXT1632(auVar100),auVar226);
        auVar106 = vandps_avx(auVar109,auVar226);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        auVar108 = vandps_avx(auVar117,auVar226);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar221._4_4_ = fVar171;
        auVar221._0_4_ = fVar171;
        auVar221._8_4_ = fVar171;
        auVar221._12_4_ = fVar171;
        auVar221._16_4_ = fVar171;
        auVar221._20_4_ = fVar171;
        auVar221._24_4_ = fVar171;
        auVar221._28_4_ = fVar171;
        uVar83 = vcmpps_avx512vl(auVar108,auVar221,1);
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar120._0_4_ = (float)((uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar100._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar100._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar100._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar100._12_4_);
        fVar165 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar105._16_4_);
        auVar120._16_4_ = fVar165;
        fVar171 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar105._20_4_);
        auVar120._20_4_ = fVar171;
        fVar153 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar105._24_4_);
        auVar120._24_4_ = fVar153;
        uVar84 = (uint)(byte)(uVar83 >> 7) * auVar105._28_4_;
        auVar120._28_4_ = uVar84;
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar121._0_4_ = (float)((uint)bVar17 * auVar113._0_4_ | (uint)!bVar17 * auVar109._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * auVar109._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * auVar109._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * auVar109._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * auVar109._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * auVar109._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * auVar109._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar121._28_4_ = (uint)bVar17 * auVar113._28_4_ | (uint)!bVar17 * auVar109._28_4_;
        auVar108 = vandps_avx(auVar226,ZEXT1632(auVar101));
        auVar106 = vandps_avx(auVar119,auVar226);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        auVar108 = vandps_avx(auVar118,auVar226);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        uVar83 = vcmpps_avx512vl(auVar108,auVar221,1);
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar122._0_4_ = (float)((uint)bVar17 * auVar105._0_4_ | (uint)!bVar17 * auVar101._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar17 * auVar105._4_4_ | (uint)!bVar17 * auVar101._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar17 * auVar105._8_4_ | (uint)!bVar17 * auVar101._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar17 * auVar105._12_4_ | (uint)!bVar17 * auVar101._12_4_);
        fVar178 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar105._16_4_);
        auVar122._16_4_ = fVar178;
        fVar166 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar105._20_4_);
        auVar122._20_4_ = fVar166;
        fVar192 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar105._24_4_);
        auVar122._24_4_ = fVar192;
        auVar122._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar105._28_4_;
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar123._0_4_ = (float)((uint)bVar17 * auVar113._0_4_ | (uint)!bVar17 * auVar119._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * auVar119._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * auVar119._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * auVar119._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * auVar119._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * auVar119._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * auVar119._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar17 * auVar113._28_4_ | (uint)!bVar17 * auVar119._28_4_;
        auVar102 = vxorps_avx512vl(auVar102,auVar102);
        auVar108 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar102));
        auVar100 = vfmadd231ps_fma(auVar108,auVar121,auVar121);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
        fVar93 = auVar108._0_4_;
        fVar94 = auVar108._4_4_;
        fVar177 = auVar108._8_4_;
        fVar145 = auVar108._12_4_;
        fVar146 = auVar108._16_4_;
        fVar147 = auVar108._20_4_;
        fVar149 = auVar108._24_4_;
        auVar39._4_4_ = fVar94 * fVar94 * fVar94 * auVar100._4_4_ * -0.5;
        auVar39._0_4_ = fVar93 * fVar93 * fVar93 * auVar100._0_4_ * -0.5;
        auVar39._8_4_ = fVar177 * fVar177 * fVar177 * auVar100._8_4_ * -0.5;
        auVar39._12_4_ = fVar145 * fVar145 * fVar145 * auVar100._12_4_ * -0.5;
        auVar39._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
        auVar39._20_4_ = fVar147 * fVar147 * fVar147 * -0.0;
        auVar39._24_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar39._28_4_ = 0;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar119 = vfmadd231ps_avx512vl(auVar39,auVar106,auVar108);
        auVar40._4_4_ = auVar121._4_4_ * auVar119._4_4_;
        auVar40._0_4_ = auVar121._0_4_ * auVar119._0_4_;
        auVar40._8_4_ = auVar121._8_4_ * auVar119._8_4_;
        auVar40._12_4_ = auVar121._12_4_ * auVar119._12_4_;
        auVar40._16_4_ = auVar121._16_4_ * auVar119._16_4_;
        auVar40._20_4_ = auVar121._20_4_ * auVar119._20_4_;
        auVar40._24_4_ = auVar121._24_4_ * auVar119._24_4_;
        auVar40._28_4_ = auVar108._28_4_;
        auVar41._4_4_ = auVar119._4_4_ * -auVar120._4_4_;
        auVar41._0_4_ = auVar119._0_4_ * -auVar120._0_4_;
        auVar41._8_4_ = auVar119._8_4_ * -auVar120._8_4_;
        auVar41._12_4_ = auVar119._12_4_ * -auVar120._12_4_;
        auVar41._16_4_ = auVar119._16_4_ * -fVar165;
        auVar41._20_4_ = auVar119._20_4_ * -fVar171;
        auVar41._24_4_ = auVar119._24_4_ * -fVar153;
        auVar41._28_4_ = uVar84 ^ 0x80000000;
        auVar108 = vmulps_avx512vl(auVar119,ZEXT1632(auVar102));
        auVar117 = ZEXT1632(auVar102);
        auVar118 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar117);
        auVar100 = vfmadd231ps_fma(auVar118,auVar123,auVar123);
        auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
        fVar171 = auVar118._0_4_;
        fVar153 = auVar118._4_4_;
        fVar165 = auVar118._8_4_;
        fVar93 = auVar118._12_4_;
        fVar94 = auVar118._16_4_;
        fVar177 = auVar118._20_4_;
        fVar145 = auVar118._24_4_;
        auVar42._4_4_ = fVar153 * fVar153 * fVar153 * auVar100._4_4_ * -0.5;
        auVar42._0_4_ = fVar171 * fVar171 * fVar171 * auVar100._0_4_ * -0.5;
        auVar42._8_4_ = fVar165 * fVar165 * fVar165 * auVar100._8_4_ * -0.5;
        auVar42._12_4_ = fVar93 * fVar93 * fVar93 * auVar100._12_4_ * -0.5;
        auVar42._16_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar42._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar42._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar42._28_4_ = 0;
        auVar106 = vfmadd231ps_avx512vl(auVar42,auVar106,auVar118);
        auVar43._4_4_ = auVar123._4_4_ * auVar106._4_4_;
        auVar43._0_4_ = auVar123._0_4_ * auVar106._0_4_;
        auVar43._8_4_ = auVar123._8_4_ * auVar106._8_4_;
        auVar43._12_4_ = auVar123._12_4_ * auVar106._12_4_;
        auVar43._16_4_ = auVar123._16_4_ * auVar106._16_4_;
        auVar43._20_4_ = auVar123._20_4_ * auVar106._20_4_;
        auVar43._24_4_ = auVar123._24_4_ * auVar106._24_4_;
        auVar43._28_4_ = auVar118._28_4_;
        auVar44._4_4_ = -auVar122._4_4_ * auVar106._4_4_;
        auVar44._0_4_ = -auVar122._0_4_ * auVar106._0_4_;
        auVar44._8_4_ = -auVar122._8_4_ * auVar106._8_4_;
        auVar44._12_4_ = -auVar122._12_4_ * auVar106._12_4_;
        auVar44._16_4_ = -fVar178 * auVar106._16_4_;
        auVar44._20_4_ = -fVar166 * auVar106._20_4_;
        auVar44._24_4_ = -fVar192 * auVar106._24_4_;
        auVar44._28_4_ = auVar119._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,auVar117);
        auVar100 = vfmadd213ps_fma(auVar40,auVar103,auVar111);
        auVar101 = vfmadd213ps_fma(auVar41,auVar103,auVar112);
        auVar119 = vfmadd213ps_avx512vl(auVar108,auVar103,auVar110);
        auVar118 = vfmadd213ps_avx512vl(auVar43,auVar104,ZEXT1632(auVar186));
        auVar96 = vfnmadd213ps_fma(auVar40,auVar103,auVar111);
        auVar99 = vfmadd213ps_fma(auVar44,auVar104,ZEXT1632(auVar168));
        auVar214 = vfnmadd213ps_fma(auVar41,auVar103,auVar112);
        auVar98 = vfmadd213ps_fma(auVar106,auVar104,auVar107);
        auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar103,auVar108);
        auVar215 = vfnmadd213ps_fma(auVar43,auVar104,ZEXT1632(auVar186));
        auVar30 = vfnmadd213ps_fma(auVar44,auVar104,ZEXT1632(auVar168));
        auVar97 = vfnmadd231ps_fma(auVar107,auVar104,auVar106);
        auVar106 = vsubps_avx512vl(auVar118,ZEXT1632(auVar96));
        auVar108 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar214));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar98),auVar109);
        auVar110 = vmulps_avx512vl(auVar108,auVar109);
        auVar186 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar214),auVar107);
        auVar45._4_4_ = auVar96._4_4_ * auVar107._4_4_;
        auVar45._0_4_ = auVar96._0_4_ * auVar107._0_4_;
        auVar45._8_4_ = auVar96._8_4_ * auVar107._8_4_;
        auVar45._12_4_ = auVar96._12_4_ * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar45,auVar109,auVar106);
        auVar46._4_4_ = auVar214._4_4_ * auVar106._4_4_;
        auVar46._0_4_ = auVar214._0_4_ * auVar106._0_4_;
        auVar46._8_4_ = auVar214._8_4_ * auVar106._8_4_;
        auVar46._12_4_ = auVar214._12_4_ * auVar106._12_4_;
        auVar46._16_4_ = auVar106._16_4_ * 0.0;
        auVar46._20_4_ = auVar106._20_4_ * 0.0;
        auVar46._24_4_ = auVar106._24_4_ * 0.0;
        auVar46._28_4_ = auVar106._28_4_;
        auVar168 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar96),auVar108);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar168),auVar117,auVar107);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,ZEXT1632(auVar186));
        auVar113 = ZEXT1632(auVar102);
        uVar83 = vcmpps_avx512vl(auVar108,auVar113,2);
        bVar82 = (byte)uVar83;
        fVar93 = (float)((uint)(bVar82 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar215._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar177 = (float)((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * auVar215._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar146 = (float)((uint)bVar17 * auVar100._8_4_ | (uint)!bVar17 * auVar215._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar149 = (float)((uint)bVar17 * auVar100._12_4_ | (uint)!bVar17 * auVar215._12_4_);
        auVar110 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar146,CONCAT44(fVar177,fVar93))));
        fVar94 = (float)((uint)(bVar82 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar30._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar145 = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar30._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar147 = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar30._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar150 = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar30._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar147,CONCAT44(fVar145,fVar94))));
        auVar124._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar97._0_4_
                    );
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar17 * auVar119._4_4_ | (uint)!bVar17 * auVar97._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar17 * auVar119._8_4_ | (uint)!bVar17 * auVar97._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar17 * auVar119._12_4_ | (uint)!bVar17 * auVar97._12_4_);
        fVar171 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_);
        auVar124._16_4_ = fVar171;
        fVar153 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_);
        auVar124._20_4_ = fVar153;
        fVar165 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_);
        auVar124._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
        auVar124._28_4_ = iVar1;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar118);
        auVar125._0_4_ =
             (uint)(bVar82 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar186._0_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar186._4_4_;
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar186._8_4_;
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar186._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_;
        auVar125._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(ZEXT1632(auVar214),ZEXT1632(auVar99));
        auVar126._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar106._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar101._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar101._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar101._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar101._12_4_);
        fVar166 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_);
        auVar126._16_4_ = fVar166;
        fVar178 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_);
        auVar126._20_4_ = fVar178;
        fVar192 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_);
        auVar126._24_4_ = fVar192;
        auVar126._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar106._28_4_;
        auVar106 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar98));
        auVar127._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar106._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar119._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar119._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar119._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar119._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar119._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar119._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar119._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar127._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar119._28_4_;
        auVar128._0_4_ =
             (uint)(bVar82 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar118._0_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar17 * (int)auVar96._4_4_ | (uint)!bVar17 * auVar118._4_4_;
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar17 * (int)auVar96._8_4_ | (uint)!bVar17 * auVar118._8_4_;
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar17 * (int)auVar96._12_4_ | (uint)!bVar17 * auVar118._12_4_;
        auVar128._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar118._16_4_;
        auVar128._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar118._20_4_;
        auVar128._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar118._24_4_;
        auVar128._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar118._28_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar129._0_4_ =
             (uint)(bVar82 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar98._0_4_;
        bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar98._4_4_;
        bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar98._8_4_;
        bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar98._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar109._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar109._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar109._28_4_;
        auVar129._28_4_ = iVar2;
        auVar111 = vsubps_avx512vl(auVar128,auVar110);
        auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar214._12_4_ |
                                                 (uint)!bVar20 * auVar99._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar214._8_4_ |
                                                          (uint)!bVar19 * auVar99._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar214._4_4_ |
                                                                   (uint)!bVar17 * auVar99._4_4_,
                                                                   (uint)(bVar82 & 1) *
                                                                   (int)auVar214._0_4_ |
                                                                   (uint)!(bool)(bVar82 & 1) *
                                                                   auVar99._0_4_)))),auVar117);
        auVar209 = ZEXT3264(auVar106);
        auVar119 = vsubps_avx(auVar129,auVar124);
        auVar118 = vsubps_avx(auVar110,auVar125);
        auVar213 = ZEXT3264(auVar118);
        auVar109 = vsubps_avx(auVar117,auVar126);
        auVar107 = vsubps_avx(auVar124,auVar127);
        auVar47._4_4_ = auVar119._4_4_ * fVar177;
        auVar47._0_4_ = auVar119._0_4_ * fVar93;
        auVar47._8_4_ = auVar119._8_4_ * fVar146;
        auVar47._12_4_ = auVar119._12_4_ * fVar149;
        auVar47._16_4_ = auVar119._16_4_ * 0.0;
        auVar47._20_4_ = auVar119._20_4_ * 0.0;
        auVar47._24_4_ = auVar119._24_4_ * 0.0;
        auVar47._28_4_ = iVar2;
        auVar100 = vfmsub231ps_fma(auVar47,auVar124,auVar111);
        auVar48._4_4_ = fVar145 * auVar111._4_4_;
        auVar48._0_4_ = fVar94 * auVar111._0_4_;
        auVar48._8_4_ = fVar147 * auVar111._8_4_;
        auVar48._12_4_ = fVar150 * auVar111._12_4_;
        auVar48._16_4_ = auVar111._16_4_ * 0.0;
        auVar48._20_4_ = auVar111._20_4_ * 0.0;
        auVar48._24_4_ = auVar111._24_4_ * 0.0;
        auVar48._28_4_ = auVar108._28_4_;
        auVar101 = vfmsub231ps_fma(auVar48,auVar110,auVar106);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar113,ZEXT1632(auVar100));
        auVar194._0_4_ = auVar106._0_4_ * auVar124._0_4_;
        auVar194._4_4_ = auVar106._4_4_ * auVar124._4_4_;
        auVar194._8_4_ = auVar106._8_4_ * auVar124._8_4_;
        auVar194._12_4_ = auVar106._12_4_ * auVar124._12_4_;
        auVar194._16_4_ = auVar106._16_4_ * fVar171;
        auVar194._20_4_ = auVar106._20_4_ * fVar153;
        auVar194._24_4_ = auVar106._24_4_ * fVar165;
        auVar194._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar194,auVar117,auVar119);
        auVar112 = vfmadd231ps_avx512vl(auVar108,auVar113,ZEXT1632(auVar100));
        auVar108 = vmulps_avx512vl(auVar107,auVar125);
        auVar108 = vfmsub231ps_avx512vl(auVar108,auVar118,auVar127);
        auVar49._4_4_ = auVar109._4_4_ * auVar127._4_4_;
        auVar49._0_4_ = auVar109._0_4_ * auVar127._0_4_;
        auVar49._8_4_ = auVar109._8_4_ * auVar127._8_4_;
        auVar49._12_4_ = auVar109._12_4_ * auVar127._12_4_;
        auVar49._16_4_ = auVar109._16_4_ * auVar127._16_4_;
        auVar49._20_4_ = auVar109._20_4_ * auVar127._20_4_;
        auVar49._24_4_ = auVar109._24_4_ * auVar127._24_4_;
        auVar49._28_4_ = auVar127._28_4_;
        auVar100 = vfmsub231ps_fma(auVar49,auVar126,auVar107);
        auVar195._0_4_ = auVar126._0_4_ * auVar118._0_4_;
        auVar195._4_4_ = auVar126._4_4_ * auVar118._4_4_;
        auVar195._8_4_ = auVar126._8_4_ * auVar118._8_4_;
        auVar195._12_4_ = auVar126._12_4_ * auVar118._12_4_;
        auVar195._16_4_ = fVar166 * auVar118._16_4_;
        auVar195._20_4_ = fVar178 * auVar118._20_4_;
        auVar195._24_4_ = fVar192 * auVar118._24_4_;
        auVar195._28_4_ = 0;
        auVar101 = vfmsub231ps_fma(auVar195,auVar109,auVar125);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar113,auVar108);
        auVar105 = vfmadd231ps_avx512vl(auVar108,auVar113,ZEXT1632(auVar100));
        auVar200 = ZEXT3264(auVar105);
        auVar108 = vmaxps_avx(auVar112,auVar105);
        uVar25 = vcmpps_avx512vl(auVar108,auVar113,2);
        bVar92 = bVar92 & (byte)uVar25;
        if (bVar92 != 0) {
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar227._4_4_ = uVar154;
          auVar227._0_4_ = uVar154;
          auVar227._8_4_ = uVar154;
          auVar227._12_4_ = uVar154;
          auVar227._16_4_ = uVar154;
          auVar227._20_4_ = uVar154;
          auVar227._24_4_ = uVar154;
          auVar227._28_4_ = uVar154;
          auVar230 = ZEXT3264(auVar227);
          auVar50._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar50._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar50._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar50._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar50._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar50._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar50._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar50._28_4_ = auVar108._28_4_;
          auVar186 = vfmsub231ps_fma(auVar50,auVar109,auVar119);
          auVar51._4_4_ = auVar119._4_4_ * auVar118._4_4_;
          auVar51._0_4_ = auVar119._0_4_ * auVar118._0_4_;
          auVar51._8_4_ = auVar119._8_4_ * auVar118._8_4_;
          auVar51._12_4_ = auVar119._12_4_ * auVar118._12_4_;
          auVar51._16_4_ = auVar119._16_4_ * auVar118._16_4_;
          auVar51._20_4_ = auVar119._20_4_ * auVar118._20_4_;
          auVar51._24_4_ = auVar119._24_4_ * auVar118._24_4_;
          auVar51._28_4_ = auVar119._28_4_;
          auVar99 = vfmsub231ps_fma(auVar51,auVar111,auVar107);
          auVar52._4_4_ = auVar109._4_4_ * auVar111._4_4_;
          auVar52._0_4_ = auVar109._0_4_ * auVar111._0_4_;
          auVar52._8_4_ = auVar109._8_4_ * auVar111._8_4_;
          auVar52._12_4_ = auVar109._12_4_ * auVar111._12_4_;
          auVar52._16_4_ = auVar109._16_4_ * auVar111._16_4_;
          auVar52._20_4_ = auVar109._20_4_ * auVar111._20_4_;
          auVar52._24_4_ = auVar109._24_4_ * auVar111._24_4_;
          auVar52._28_4_ = auVar109._28_4_;
          auVar168 = vfmsub231ps_fma(auVar52,auVar118,auVar106);
          auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar168));
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar186),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar101));
          auVar213 = ZEXT3264(auVar108);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar106 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar101),auVar31);
          auVar100 = vfmadd132ps_fma(auVar106,auVar108,auVar108);
          auVar209 = ZEXT1664(auVar100);
          auVar53._4_4_ = auVar168._4_4_ * auVar124._4_4_;
          auVar53._0_4_ = auVar168._0_4_ * auVar124._0_4_;
          auVar53._8_4_ = auVar168._8_4_ * auVar124._8_4_;
          auVar53._12_4_ = auVar168._12_4_ * auVar124._12_4_;
          auVar53._16_4_ = fVar171 * 0.0;
          auVar53._20_4_ = fVar153 * 0.0;
          auVar53._24_4_ = fVar165 * 0.0;
          auVar53._28_4_ = iVar1;
          auVar99 = vfmadd231ps_fma(auVar53,auVar117,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar110,ZEXT1632(auVar186));
          fVar171 = auVar100._0_4_;
          fVar153 = auVar100._4_4_;
          fVar165 = auVar100._8_4_;
          fVar166 = auVar100._12_4_;
          local_360 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar166,
                                         CONCAT48(auVar99._8_4_ * fVar165,
                                                  CONCAT44(auVar99._4_4_ * fVar153,
                                                           auVar99._0_4_ * fVar171))));
          auVar219 = ZEXT3264(local_360);
          auVar157._4_4_ = local_4e0;
          auVar157._0_4_ = local_4e0;
          auVar157._8_4_ = local_4e0;
          auVar157._12_4_ = local_4e0;
          auVar157._16_4_ = local_4e0;
          auVar157._20_4_ = local_4e0;
          auVar157._24_4_ = local_4e0;
          auVar157._28_4_ = local_4e0;
          uVar25 = vcmpps_avx512vl(local_360,auVar227,2);
          uVar26 = vcmpps_avx512vl(auVar157,local_360,2);
          bVar92 = (byte)uVar25 & (byte)uVar26 & bVar92;
          if (bVar92 != 0) {
            uVar87 = vcmpps_avx512vl(ZEXT1632(auVar101),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar87 = bVar92 & uVar87;
            if ((char)uVar87 != '\0') {
              fVar178 = auVar112._0_4_ * fVar171;
              fVar192 = auVar112._4_4_ * fVar153;
              auVar54._4_4_ = fVar192;
              auVar54._0_4_ = fVar178;
              fVar93 = auVar112._8_4_ * fVar165;
              auVar54._8_4_ = fVar93;
              fVar94 = auVar112._12_4_ * fVar166;
              auVar54._12_4_ = fVar94;
              fVar177 = auVar112._16_4_ * 0.0;
              auVar54._16_4_ = fVar177;
              fVar145 = auVar112._20_4_ * 0.0;
              auVar54._20_4_ = fVar145;
              fVar146 = auVar112._24_4_ * 0.0;
              auVar54._24_4_ = fVar146;
              auVar54._28_4_ = auVar112._28_4_;
              auVar158._8_4_ = 0x3f800000;
              auVar158._0_8_ = 0x3f8000003f800000;
              auVar158._12_4_ = 0x3f800000;
              auVar158._16_4_ = 0x3f800000;
              auVar158._20_4_ = 0x3f800000;
              auVar158._24_4_ = 0x3f800000;
              auVar158._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar158,auVar54);
              local_3a0._0_4_ =
                   (float)((uint)(bVar82 & 1) * (int)fVar178 |
                          (uint)!(bool)(bVar82 & 1) * auVar108._0_4_);
              bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
              local_3a0._4_4_ =
                   (float)((uint)bVar17 * (int)fVar192 | (uint)!bVar17 * auVar108._4_4_);
              bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
              local_3a0._8_4_ = (float)((uint)bVar17 * (int)fVar93 | (uint)!bVar17 * auVar108._8_4_)
              ;
              bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
              local_3a0._12_4_ =
                   (float)((uint)bVar17 * (int)fVar94 | (uint)!bVar17 * auVar108._12_4_);
              bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
              local_3a0._16_4_ =
                   (float)((uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar108._16_4_);
              bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
              local_3a0._20_4_ =
                   (float)((uint)bVar17 * (int)fVar145 | (uint)!bVar17 * auVar108._20_4_);
              bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
              local_3a0._24_4_ =
                   (float)((uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar108._24_4_);
              bVar17 = SUB81(uVar83 >> 7,0);
              local_3a0._28_4_ =
                   (float)((uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar108._28_4_);
              auVar108 = vsubps_avx(auVar104,auVar103);
              auVar100 = vfmadd213ps_fma(auVar108,local_3a0,auVar103);
              uVar154 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar32._4_4_ = uVar154;
              auVar32._0_4_ = uVar154;
              auVar32._8_4_ = uVar154;
              auVar32._12_4_ = uVar154;
              auVar32._16_4_ = uVar154;
              auVar32._20_4_ = uVar154;
              auVar32._24_4_ = uVar154;
              auVar32._28_4_ = uVar154;
              auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                            CONCAT48(auVar100._8_4_ + auVar100._8_4_
                                                                     ,CONCAT44(auVar100._4_4_ +
                                                                               auVar100._4_4_,
                                                                               auVar100._0_4_ +
                                                                               auVar100._0_4_)))),
                                         auVar32);
              uVar27 = vcmpps_avx512vl(local_360,auVar108,6);
              uVar87 = uVar87 & uVar27;
              bVar92 = (byte)uVar87;
              if (bVar92 != 0) {
                auVar175._0_4_ = auVar105._0_4_ * fVar171;
                auVar175._4_4_ = auVar105._4_4_ * fVar153;
                auVar175._8_4_ = auVar105._8_4_ * fVar165;
                auVar175._12_4_ = auVar105._12_4_ * fVar166;
                auVar175._16_4_ = auVar105._16_4_ * 0.0;
                auVar175._20_4_ = auVar105._20_4_ * 0.0;
                auVar175._24_4_ = auVar105._24_4_ * 0.0;
                auVar175._28_4_ = 0;
                auVar189._8_4_ = 0x3f800000;
                auVar189._0_8_ = 0x3f8000003f800000;
                auVar189._12_4_ = 0x3f800000;
                auVar189._16_4_ = 0x3f800000;
                auVar189._20_4_ = 0x3f800000;
                auVar189._24_4_ = 0x3f800000;
                auVar189._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar189,auVar175);
                auVar130._0_4_ =
                     (uint)(bVar82 & 1) * (int)auVar175._0_4_ |
                     (uint)!(bool)(bVar82 & 1) * auVar108._0_4_;
                bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                auVar130._4_4_ = (uint)bVar17 * (int)auVar175._4_4_ | (uint)!bVar17 * auVar108._4_4_
                ;
                bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                auVar130._8_4_ = (uint)bVar17 * (int)auVar175._8_4_ | (uint)!bVar17 * auVar108._8_4_
                ;
                bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
                auVar130._12_4_ =
                     (uint)bVar17 * (int)auVar175._12_4_ | (uint)!bVar17 * auVar108._12_4_;
                bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
                auVar130._16_4_ =
                     (uint)bVar17 * (int)auVar175._16_4_ | (uint)!bVar17 * auVar108._16_4_;
                bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                auVar130._20_4_ =
                     (uint)bVar17 * (int)auVar175._20_4_ | (uint)!bVar17 * auVar108._20_4_;
                bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
                auVar130._24_4_ =
                     (uint)bVar17 * (int)auVar175._24_4_ | (uint)!bVar17 * auVar108._24_4_;
                auVar130._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar108._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_380 = vfmsub132ps_avx512vl(auVar130,auVar189,auVar33);
                local_340 = 0;
                if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar171 = 1.0 / auVar222._0_4_;
                  local_2e0[0] = fVar171 * (local_3a0._0_4_ + 0.0);
                  local_2e0[1] = fVar171 * (local_3a0._4_4_ + 1.0);
                  local_2e0[2] = fVar171 * (local_3a0._8_4_ + 2.0);
                  local_2e0[3] = fVar171 * (local_3a0._12_4_ + 3.0);
                  fStack_2d0 = fVar171 * (local_3a0._16_4_ + 4.0);
                  fStack_2cc = fVar171 * (local_3a0._20_4_ + 5.0);
                  fStack_2c8 = fVar171 * (local_3a0._24_4_ + 6.0);
                  fStack_2c4 = local_3a0._28_4_ + 7.0;
                  local_2c0 = local_380;
                  local_2a0 = local_360;
                  auVar159._8_4_ = 0x7f800000;
                  auVar159._0_8_ = 0x7f8000007f800000;
                  auVar159._12_4_ = 0x7f800000;
                  auVar159._16_4_ = 0x7f800000;
                  auVar159._20_4_ = 0x7f800000;
                  auVar159._24_4_ = 0x7f800000;
                  auVar159._28_4_ = 0x7f800000;
                  auVar108 = vblendmps_avx512vl(auVar159,local_360);
                  auVar131._0_4_ =
                       (uint)(bVar92 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar131._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar131._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar131._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 4) & 1);
                  auVar131._16_4_ = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 5) & 1);
                  auVar131._20_4_ = (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)((byte)(uVar87 >> 6) & 1);
                  auVar131._24_4_ = (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = SUB81(uVar87 >> 7,0);
                  auVar131._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar108 = vshufps_avx(auVar131,auVar131,0xb1);
                  auVar108 = vminps_avx(auVar131,auVar108);
                  auVar106 = vshufpd_avx(auVar108,auVar108,5);
                  auVar108 = vminps_avx(auVar108,auVar106);
                  auVar106 = vpermpd_avx2(auVar108,0x4e);
                  auVar108 = vminps_avx(auVar108,auVar106);
                  uVar25 = vcmpps_avx512vl(auVar131,auVar108,0);
                  uVar84 = (uint)uVar87;
                  if (((byte)uVar25 & bVar92) != 0) {
                    uVar84 = (uint)((byte)uVar25 & bVar92);
                  }
                  uVar85 = 0;
                  for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                    uVar85 = uVar85 + 1;
                  }
                  uVar83 = (ulong)uVar85;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_600 = auVar114;
                    local_5c0 = local_360;
                    local_5a0 = pGVar91;
                    local_33c = iVar86;
                    local_330 = auVar95;
                    local_320 = uVar24;
                    uStack_318 = uVar28;
                    local_310 = uVar77;
                    uStack_308 = uVar78;
                    local_300 = uVar79;
                    uStack_2f8 = uVar80;
                    do {
                      fVar171 = local_2e0[uVar83];
                      auVar168._4_4_ = fVar171;
                      auVar168._0_4_ = fVar171;
                      auVar168._8_4_ = fVar171;
                      auVar168._12_4_ = fVar171;
                      local_1e0._16_4_ = fVar171;
                      local_1e0._0_16_ = auVar168;
                      local_1e0._20_4_ = fVar171;
                      local_1e0._24_4_ = fVar171;
                      local_1e0._28_4_ = fVar171;
                      local_1c0 = *(undefined4 *)(local_2c0 + uVar83 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar83 * 4)
                      ;
                      local_678.context = context->user;
                      fVar153 = 1.0 - fVar171;
                      auVar186 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar153 + fVar153))),
                                                  ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
                      auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar168,
                                                 ZEXT416(0xc0a00000));
                      auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                                 ZEXT416((uint)(fVar171 + fVar171)),auVar100);
                      auVar213 = ZEXT1664(auVar101);
                      auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar168,
                                                 ZEXT416(0x40000000));
                      auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * -3.0)),
                                                 ZEXT416((uint)(fVar153 + fVar153)),auVar100);
                      auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar168,
                                                ZEXT416((uint)(fVar153 * -2.0)));
                      fVar171 = auVar186._0_4_ * 0.5;
                      fVar153 = auVar101._0_4_ * 0.5;
                      fVar165 = auVar100._0_4_ * 0.5;
                      fVar166 = auVar99._0_4_ * 0.5;
                      auVar186._0_4_ = fVar166 * local_6c0;
                      auVar186._4_4_ = fVar166 * fStack_6bc;
                      auVar186._8_4_ = fVar166 * fStack_6b8;
                      auVar186._12_4_ = fVar166 * fStack_6b4;
                      auVar205._4_4_ = fVar165;
                      auVar205._0_4_ = fVar165;
                      auVar205._8_4_ = fVar165;
                      auVar205._12_4_ = fVar165;
                      auVar100 = vfmadd132ps_fma(auVar205,auVar186,auVar155);
                      auVar187._4_4_ = fVar153;
                      auVar187._0_4_ = fVar153;
                      auVar187._8_4_ = fVar153;
                      auVar187._12_4_ = fVar153;
                      auVar100 = vfmadd132ps_fma(auVar187,auVar100,auVar8);
                      auVar99._4_4_ = fVar171;
                      auVar99._0_4_ = fVar171;
                      auVar99._8_4_ = fVar171;
                      auVar99._12_4_ = fVar171;
                      auVar100 = vfmadd213ps_fma(auVar99,auVar95,auVar100);
                      local_240 = auVar100._0_4_;
                      auVar199._8_4_ = 1;
                      auVar199._0_8_ = 0x100000001;
                      auVar199._12_4_ = 1;
                      auVar199._16_4_ = 1;
                      auVar199._20_4_ = 1;
                      auVar199._24_4_ = 1;
                      auVar199._28_4_ = 1;
                      local_220 = vpermps_avx2(auVar199,ZEXT1632(auVar100));
                      auVar200 = ZEXT3264(local_220);
                      auVar206._8_4_ = 2;
                      auVar206._0_8_ = 0x200000002;
                      auVar206._12_4_ = 2;
                      auVar208._16_4_ = 2;
                      auVar208._0_16_ = auVar206;
                      auVar208._20_4_ = 2;
                      auVar208._24_4_ = 2;
                      auVar208._28_4_ = 2;
                      auVar209 = ZEXT3264(auVar208);
                      local_200 = vpermps_avx2(auVar208,ZEXT1632(auVar100));
                      iStack_23c = local_240;
                      iStack_238 = local_240;
                      iStack_234 = local_240;
                      iStack_230 = local_240;
                      iStack_22c = local_240;
                      iStack_228 = local_240;
                      iStack_224 = local_240;
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = local_540._0_8_;
                      uStack_198 = local_540._8_8_;
                      uStack_190 = local_540._16_8_;
                      uStack_188 = local_540._24_8_;
                      local_180 = local_4c0;
                      auVar108 = vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_648[1] = auVar108;
                      *local_648 = auVar108;
                      local_160 = (local_678.context)->instID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_140 = (local_678.context)->instPrimID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_640 = local_280;
                      local_678.valid = (int *)local_640;
                      local_678.geometryUserPtr = pGVar91->userPtr;
                      local_678.hit = (RTCHitN *)&local_240;
                      local_678.N = 8;
                      local_520 = auVar230._0_32_;
                      local_678.ray = (RTCRayN *)ray;
                      if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar200 = ZEXT1664(local_220._0_16_);
                        auVar209 = ZEXT1664(auVar206);
                        auVar213 = ZEXT1664(auVar101);
                        (*pGVar91->intersectionFilterN)(&local_678);
                        auVar219 = ZEXT3264(local_5c0);
                        auVar230 = ZEXT3264(local_520);
                        auVar231 = ZEXT3264(local_600);
                        auVar234 = ZEXT3264(local_580);
                        auVar232 = ZEXT3264(local_560);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar233 = ZEXT1664(auVar100);
                        pGVar91 = local_5a0;
                      }
                      if (local_640 == (undefined1  [32])0x0) {
LAB_01d29582:
                        *(int *)(ray + k * 4 + 0x100) = auVar230._0_4_;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*p_Var16)(&local_678);
                          auVar219 = ZEXT3264(local_5c0);
                          auVar230 = ZEXT3264(local_520);
                          auVar231 = ZEXT3264(local_600);
                          auVar234 = ZEXT3264(local_580);
                          auVar232 = ZEXT3264(local_560);
                          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar233 = ZEXT1664(auVar100);
                          pGVar91 = local_5a0;
                        }
                        if (local_640 == (undefined1  [32])0x0) goto LAB_01d29582;
                        uVar27 = vptestmd_avx512vl(local_640,local_640);
                        iVar1 = *(int *)(local_678.hit + 4);
                        iVar2 = *(int *)(local_678.hit + 8);
                        iVar72 = *(int *)(local_678.hit + 0xc);
                        iVar73 = *(int *)(local_678.hit + 0x10);
                        iVar74 = *(int *)(local_678.hit + 0x14);
                        iVar75 = *(int *)(local_678.hit + 0x18);
                        iVar76 = *(int *)(local_678.hit + 0x1c);
                        bVar92 = (byte)uVar27;
                        bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar23 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x180) =
                             (uint)(bVar92 & 1) * *(int *)local_678.hit |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x180);
                        *(uint *)(local_678.ray + 0x184) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_678.ray + 0x184);
                        *(uint *)(local_678.ray + 0x188) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_678.ray + 0x188);
                        *(uint *)(local_678.ray + 0x18c) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_678.ray + 0x18c)
                        ;
                        *(uint *)(local_678.ray + 400) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_678.ray + 400);
                        *(uint *)(local_678.ray + 0x194) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_678.ray + 0x194)
                        ;
                        *(uint *)(local_678.ray + 0x198) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_678.ray + 0x198)
                        ;
                        *(uint *)(local_678.ray + 0x19c) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_678.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x24);
                        iVar2 = *(int *)(local_678.hit + 0x28);
                        iVar72 = *(int *)(local_678.hit + 0x2c);
                        iVar73 = *(int *)(local_678.hit + 0x30);
                        iVar74 = *(int *)(local_678.hit + 0x34);
                        iVar75 = *(int *)(local_678.hit + 0x38);
                        iVar76 = *(int *)(local_678.hit + 0x3c);
                        bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar23 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1a0) =
                             (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x20) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1a0);
                        *(uint *)(local_678.ray + 0x1a4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1a4);
                        *(uint *)(local_678.ray + 0x1a8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1a8);
                        *(uint *)(local_678.ray + 0x1ac) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_678.ray + 0x1ac)
                        ;
                        *(uint *)(local_678.ray + 0x1b0) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_678.ray + 0x1b0)
                        ;
                        *(uint *)(local_678.ray + 0x1b4) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_678.ray + 0x1b4)
                        ;
                        *(uint *)(local_678.ray + 0x1b8) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1b8)
                        ;
                        *(uint *)(local_678.ray + 0x1bc) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x44);
                        iVar2 = *(int *)(local_678.hit + 0x48);
                        iVar72 = *(int *)(local_678.hit + 0x4c);
                        iVar73 = *(int *)(local_678.hit + 0x50);
                        iVar74 = *(int *)(local_678.hit + 0x54);
                        iVar75 = *(int *)(local_678.hit + 0x58);
                        iVar76 = *(int *)(local_678.hit + 0x5c);
                        bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar23 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1c0) =
                             (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x40) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1c0);
                        *(uint *)(local_678.ray + 0x1c4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1c4);
                        *(uint *)(local_678.ray + 0x1c8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1c8);
                        *(uint *)(local_678.ray + 0x1cc) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_678.ray + 0x1cc)
                        ;
                        *(uint *)(local_678.ray + 0x1d0) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_678.ray + 0x1d0)
                        ;
                        *(uint *)(local_678.ray + 0x1d4) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_678.ray + 0x1d4)
                        ;
                        *(uint *)(local_678.ray + 0x1d8) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1d8)
                        ;
                        *(uint *)(local_678.ray + 0x1dc) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 100);
                        iVar2 = *(int *)(local_678.hit + 0x68);
                        iVar72 = *(int *)(local_678.hit + 0x6c);
                        iVar73 = *(int *)(local_678.hit + 0x70);
                        iVar74 = *(int *)(local_678.hit + 0x74);
                        iVar75 = *(int *)(local_678.hit + 0x78);
                        iVar76 = *(int *)(local_678.hit + 0x7c);
                        bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar23 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1e0) =
                             (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x60) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1e0);
                        *(uint *)(local_678.ray + 0x1e4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1e4);
                        *(uint *)(local_678.ray + 0x1e8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1e8);
                        *(uint *)(local_678.ray + 0x1ec) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_678.ray + 0x1ec)
                        ;
                        *(uint *)(local_678.ray + 0x1f0) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_678.ray + 0x1f0)
                        ;
                        *(uint *)(local_678.ray + 500) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_678.ray + 500);
                        *(uint *)(local_678.ray + 0x1f8) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_678.ray + 0x1f8)
                        ;
                        *(uint *)(local_678.ray + 0x1fc) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_678.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x84);
                        iVar2 = *(int *)(local_678.hit + 0x88);
                        iVar72 = *(int *)(local_678.hit + 0x8c);
                        iVar73 = *(int *)(local_678.hit + 0x90);
                        iVar74 = *(int *)(local_678.hit + 0x94);
                        iVar75 = *(int *)(local_678.hit + 0x98);
                        iVar76 = *(int *)(local_678.hit + 0x9c);
                        bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar19 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar20 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar21 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar22 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar23 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x200) =
                             (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x80) |
                             (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x200);
                        *(uint *)(local_678.ray + 0x204) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_678.ray + 0x204);
                        *(uint *)(local_678.ray + 0x208) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_678.ray + 0x208);
                        *(uint *)(local_678.ray + 0x20c) =
                             (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_678.ray + 0x20c)
                        ;
                        *(uint *)(local_678.ray + 0x210) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_678.ray + 0x210)
                        ;
                        *(uint *)(local_678.ray + 0x214) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_678.ray + 0x214)
                        ;
                        *(uint *)(local_678.ray + 0x218) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_678.ray + 0x218)
                        ;
                        *(uint *)(local_678.ray + 0x21c) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_678.ray + 0x21c)
                        ;
                        auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0));
                        *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar108;
                        auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0));
                        *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar108;
                        auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0));
                        *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar108;
                        auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar108;
                        auVar230 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      auVar114 = auVar231._0_32_;
                      bVar92 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar87;
                      uVar154 = auVar230._0_4_;
                      auVar163._4_4_ = uVar154;
                      auVar163._0_4_ = uVar154;
                      auVar163._8_4_ = uVar154;
                      auVar163._12_4_ = uVar154;
                      auVar163._16_4_ = uVar154;
                      auVar163._20_4_ = uVar154;
                      auVar163._24_4_ = uVar154;
                      auVar163._28_4_ = uVar154;
                      uVar25 = vcmpps_avx512vl(auVar219._0_32_,auVar163,2);
                      if ((bVar92 & (byte)uVar25) == 0) goto LAB_01d283a7;
                      bVar92 = bVar92 & (byte)uVar25;
                      uVar87 = (ulong)bVar92;
                      auVar164._8_4_ = 0x7f800000;
                      auVar164._0_8_ = 0x7f8000007f800000;
                      auVar164._12_4_ = 0x7f800000;
                      auVar164._16_4_ = 0x7f800000;
                      auVar164._20_4_ = 0x7f800000;
                      auVar164._24_4_ = 0x7f800000;
                      auVar164._28_4_ = 0x7f800000;
                      auVar108 = vblendmps_avx512vl(auVar164,auVar219._0_32_);
                      auVar144._0_4_ =
                           (uint)(bVar92 & 1) * auVar108._0_4_ |
                           (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 1 & 1);
                      auVar144._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 2 & 1);
                      auVar144._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 3 & 1);
                      auVar144._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 4 & 1);
                      auVar144._16_4_ = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 5 & 1);
                      auVar144._20_4_ = (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)(bVar92 >> 6 & 1);
                      auVar144._24_4_ = (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar144._28_4_ =
                           (uint)(bVar92 >> 7) * auVar108._28_4_ |
                           (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                      auVar108 = vshufps_avx(auVar144,auVar144,0xb1);
                      auVar108 = vminps_avx(auVar144,auVar108);
                      auVar106 = vshufpd_avx(auVar108,auVar108,5);
                      auVar108 = vminps_avx(auVar108,auVar106);
                      auVar106 = vpermpd_avx2(auVar108,0x4e);
                      auVar108 = vminps_avx(auVar108,auVar106);
                      uVar25 = vcmpps_avx512vl(auVar144,auVar108,0);
                      bVar82 = (byte)uVar25 & bVar92;
                      if (bVar82 != 0) {
                        bVar92 = bVar82;
                      }
                      uVar84 = 0;
                      for (uVar85 = (uint)bVar92; (uVar85 & 1) == 0;
                          uVar85 = uVar85 >> 1 | 0x80000000) {
                        uVar84 = uVar84 + 1;
                      }
                      uVar83 = (ulong)uVar84;
                    } while( true );
                  }
                  fVar171 = local_2e0[uVar83];
                  uVar154 = *(undefined4 *)(local_2c0 + uVar83 * 4);
                  fVar153 = 1.0 - fVar171;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar153 + fVar153))),
                                            ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
                  auVar155 = ZEXT416((uint)fVar171);
                  auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                             ZEXT416(0xc0a00000));
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                             ZEXT416((uint)(fVar171 + fVar171)),auVar100);
                  auVar213 = ZEXT1664(auVar101);
                  auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                             ZEXT416(0x40000000));
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * -3.0)),
                                             ZEXT416((uint)(fVar153 + fVar153)),auVar100);
                  auVar155 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar155,
                                             ZEXT416((uint)(fVar153 * -2.0)));
                  fVar153 = auVar8._0_4_ * 0.5;
                  fVar165 = auVar101._0_4_ * 0.5;
                  auVar200 = ZEXT464((uint)fVar165);
                  fVar166 = auVar100._0_4_ * 0.5;
                  fVar178 = auVar155._0_4_ * 0.5;
                  auVar180._0_4_ = fVar178 * local_6c0;
                  auVar180._4_4_ = fVar178 * fStack_6bc;
                  auVar180._8_4_ = fVar178 * fStack_6b8;
                  auVar180._12_4_ = fVar178 * fStack_6b4;
                  auVar201._4_4_ = fVar166;
                  auVar201._0_4_ = fVar166;
                  auVar201._8_4_ = fVar166;
                  auVar201._12_4_ = fVar166;
                  auVar100 = vfmadd132ps_fma(auVar201,auVar180,*pauVar4);
                  auVar209 = ZEXT1664(auVar100);
                  auVar181._4_4_ = fVar165;
                  auVar181._0_4_ = fVar165;
                  auVar181._8_4_ = fVar165;
                  auVar181._12_4_ = fVar165;
                  auVar100 = vfmadd132ps_fma(auVar181,auVar100,*pauVar3);
                  auVar172._4_4_ = fVar153;
                  auVar172._0_4_ = fVar153;
                  auVar172._8_4_ = fVar153;
                  auVar172._12_4_ = fVar153;
                  auVar100 = vfmadd213ps_fma(auVar172,auVar95,auVar100);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar83 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar100._0_4_;
                  uVar15 = vextractps_avx(auVar100,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                  uVar15 = vextractps_avx(auVar100,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar171;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar154;
                  *(uint *)(ray + k * 4 + 0x220) = uVar14;
                  *(uint *)(ray + k * 4 + 0x240) = uVar88;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01d283a7:
      if (8 < iVar86) {
        auVar108 = vpbroadcastd_avx512vl();
        auVar231 = ZEXT3264(auVar108);
        local_520._4_4_ = local_5e0._0_4_;
        local_520._0_4_ = local_5e0._0_4_;
        local_520._8_4_ = local_5e0._0_4_;
        local_520._12_4_ = local_5e0._0_4_;
        local_520._16_4_ = local_5e0._0_4_;
        local_520._20_4_ = local_5e0._0_4_;
        local_520._24_4_ = local_5e0._0_4_;
        local_520._28_4_ = local_5e0._0_4_;
        uStack_4dc = local_4e0;
        uStack_4d8 = local_4e0;
        uStack_4d4 = local_4e0;
        uStack_4d0 = local_4e0;
        uStack_4cc = local_4e0;
        uStack_4c8 = local_4e0;
        uStack_4c4 = local_4e0;
        fStack_598 = 1.0 / (float)local_500._0_4_;
        local_500 = vpbroadcastd_avx512vl();
        local_4c0 = vpbroadcastd_avx512vl();
        lVar90 = 8;
        local_600 = auVar114;
        fStack_594 = fStack_598;
        fStack_590 = fStack_598;
        fStack_58c = fStack_598;
        fStack_588 = fStack_598;
        fStack_584 = fStack_598;
        local_5a0._0_4_ = fStack_598;
        local_5a0._4_4_ = fStack_598;
LAB_01d28451:
        auVar108 = vpbroadcastd_avx512vl();
        auVar108 = vpor_avx2(auVar108,_DAT_01fe9900);
        uVar26 = vpcmpgtd_avx512vl(auVar231._0_32_,auVar108);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 * 4 + lVar29);
        auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21b37f0 + lVar90 * 4);
        auVar119 = *(undefined1 (*) [32])(lVar29 + 0x21b3c74 + lVar90 * 4);
        auVar118 = *(undefined1 (*) [32])(lVar29 + 0x21b40f8 + lVar90 * 4);
        auVar219._0_4_ = auVar118._0_4_ * (float)local_480._0_4_;
        auVar219._4_4_ = auVar118._4_4_ * (float)local_480._4_4_;
        auVar219._8_4_ = auVar118._8_4_ * fStack_478;
        auVar219._12_4_ = auVar118._12_4_ * fStack_474;
        auVar219._16_4_ = auVar118._16_4_ * fStack_470;
        auVar219._20_4_ = auVar118._20_4_ * fStack_46c;
        auVar219._28_36_ = auVar209._28_36_;
        auVar219._24_4_ = auVar118._24_4_ * fStack_468;
        auVar209._0_4_ = auVar118._0_4_ * (float)local_4a0._0_4_;
        auVar209._4_4_ = auVar118._4_4_ * (float)local_4a0._4_4_;
        auVar209._8_4_ = auVar118._8_4_ * fStack_498;
        auVar209._12_4_ = auVar118._12_4_ * fStack_494;
        auVar209._16_4_ = auVar118._16_4_ * fStack_490;
        auVar209._20_4_ = auVar118._20_4_ * fStack_48c;
        auVar209._28_36_ = auVar200._28_36_;
        auVar209._24_4_ = auVar118._24_4_ * fStack_488;
        auVar109 = vmulps_avx512vl(local_100,auVar118);
        auVar107 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar119,local_440);
        auVar110 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar119,local_460);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar119,local_e0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_400);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,local_420);
        auVar117 = vfmadd231ps_avx512vl(auVar109,auVar106,local_c0);
        auVar100 = vfmadd231ps_fma(auVar107,auVar108,local_3c0);
        auVar209 = ZEXT1664(auVar100);
        auVar101 = vfmadd231ps_fma(auVar110,auVar108,local_3e0);
        auVar200 = ZEXT1664(auVar101);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 * 4 + lVar29);
        auVar107 = *(undefined1 (*) [32])(lVar29 + 0x21b5c10 + lVar90 * 4);
        auVar105 = vfmadd231ps_avx512vl(auVar117,auVar108,local_a0);
        auVar110 = *(undefined1 (*) [32])(lVar29 + 0x21b6094 + lVar90 * 4);
        auVar117 = *(undefined1 (*) [32])(lVar29 + 0x21b6518 + lVar90 * 4);
        auVar230._0_4_ = auVar117._0_4_ * (float)local_480._0_4_;
        auVar230._4_4_ = auVar117._4_4_ * (float)local_480._4_4_;
        auVar230._8_4_ = auVar117._8_4_ * fStack_478;
        auVar230._12_4_ = auVar117._12_4_ * fStack_474;
        auVar230._16_4_ = auVar117._16_4_ * fStack_470;
        auVar230._20_4_ = auVar117._20_4_ * fStack_46c;
        auVar230._28_36_ = auVar213._28_36_;
        auVar230._24_4_ = auVar117._24_4_ * fStack_468;
        auVar55._4_4_ = auVar117._4_4_ * (float)local_4a0._4_4_;
        auVar55._0_4_ = auVar117._0_4_ * (float)local_4a0._0_4_;
        auVar55._8_4_ = auVar117._8_4_ * fStack_498;
        auVar55._12_4_ = auVar117._12_4_ * fStack_494;
        auVar55._16_4_ = auVar117._16_4_ * fStack_490;
        auVar55._20_4_ = auVar117._20_4_ * fStack_48c;
        auVar55._24_4_ = auVar117._24_4_ * fStack_488;
        auVar55._28_4_ = uStack_484;
        auVar111 = vmulps_avx512vl(local_100,auVar117);
        auVar112 = vfmadd231ps_avx512vl(auVar230._0_32_,auVar110,local_440);
        auVar113 = vfmadd231ps_avx512vl(auVar55,auVar110,local_460);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar110,local_e0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_400);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_420);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,local_c0);
        auVar155 = vfmadd231ps_fma(auVar112,auVar109,local_3c0);
        auVar213 = ZEXT1664(auVar155);
        auVar8 = vfmadd231ps_fma(auVar113,auVar109,local_3e0);
        auVar113 = vfmadd231ps_avx512vl(auVar111,auVar109,local_a0);
        auVar114 = vmaxps_avx512vl(auVar105,auVar113);
        auVar111 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar100));
        auVar112 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar101));
        auVar103 = vmulps_avx512vl(ZEXT1632(auVar101),auVar111);
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar100),auVar112);
        auVar103 = vsubps_avx512vl(auVar103,auVar104);
        auVar104 = vmulps_avx512vl(auVar112,auVar112);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar111);
        auVar114 = vmulps_avx512vl(auVar114,auVar114);
        auVar114 = vmulps_avx512vl(auVar114,auVar104);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        uVar25 = vcmpps_avx512vl(auVar103,auVar114,2);
        bVar92 = (byte)uVar26 & (byte)uVar25;
        if (bVar92 != 0) {
          auVar117 = vmulps_avx512vl(local_260,auVar117);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_600,auVar117);
          local_580 = auVar234._0_32_;
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_580,auVar110);
          local_560 = auVar232._0_32_;
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_560,auVar107);
          auVar118 = vmulps_avx512vl(local_260,auVar118);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_600,auVar118);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_580,auVar119);
          auVar107 = vfmadd213ps_avx512vl(auVar108,local_560,auVar106);
          auVar108 = *(undefined1 (*) [32])(lVar29 + 0x21b457c + lVar90 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21b4a00 + lVar90 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar29 + 0x21b4e84 + lVar90 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar29 + 0x21b5308 + lVar90 * 4);
          auVar110 = vmulps_avx512vl(_local_480,auVar118);
          auVar117 = vmulps_avx512vl(_local_4a0,auVar118);
          auVar118 = vmulps_avx512vl(local_260,auVar118);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar119,local_440);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,local_460);
          auVar99 = vfmadd231ps_fma(auVar118,auVar119,local_600);
          auVar119 = vfmadd231ps_avx512vl(auVar110,auVar106,local_400);
          auVar118 = vfmadd231ps_avx512vl(auVar117,auVar106,local_420);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),local_580,auVar106);
          auVar110 = vfmadd231ps_avx512vl(auVar119,auVar108,local_3c0);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar108,local_3e0);
          auVar117 = vfmadd231ps_avx512vl(auVar106,local_560,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar29 + 0x21b699c + lVar90 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21b72a4 + lVar90 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar29 + 0x21b7728 + lVar90 * 4);
          auVar114 = vmulps_avx512vl(_local_480,auVar119);
          auVar103 = vmulps_avx512vl(_local_4a0,auVar119);
          auVar119 = vmulps_avx512vl(local_260,auVar119);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,local_440);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_460);
          auVar119 = vfmadd231ps_avx512vl(auVar119,local_600,auVar106);
          auVar106 = *(undefined1 (*) [32])(lVar29 + 0x21b6e20 + lVar90 * 4);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,local_400);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_420);
          auVar106 = vfmadd231ps_avx512vl(auVar119,local_580,auVar106);
          auVar119 = vfmadd231ps_avx512vl(auVar114,auVar108,local_3c0);
          auVar114 = vfmadd231ps_avx512vl(auVar103,auVar108,local_3e0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_560,auVar108);
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar110,auVar103);
          vandps_avx512vl(auVar118,auVar103);
          auVar108 = vmaxps_avx(auVar103,auVar103);
          vandps_avx512vl(auVar117,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar103);
          uVar83 = vcmpps_avx512vl(auVar108,local_520,1);
          bVar17 = (bool)((byte)uVar83 & 1);
          auVar132._0_4_ = (float)((uint)bVar17 * auVar111._0_4_ | (uint)!bVar17 * auVar110._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar17 * auVar111._4_4_ | (uint)!bVar17 * auVar110._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar17 * auVar111._8_4_ | (uint)!bVar17 * auVar110._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar132._12_4_ =
               (float)((uint)bVar17 * auVar111._12_4_ | (uint)!bVar17 * auVar110._12_4_);
          bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar132._16_4_ =
               (float)((uint)bVar17 * auVar111._16_4_ | (uint)!bVar17 * auVar110._16_4_);
          bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar132._20_4_ =
               (float)((uint)bVar17 * auVar111._20_4_ | (uint)!bVar17 * auVar110._20_4_);
          bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar132._24_4_ =
               (float)((uint)bVar17 * auVar111._24_4_ | (uint)!bVar17 * auVar110._24_4_);
          bVar17 = SUB81(uVar83 >> 7,0);
          auVar132._28_4_ = (uint)bVar17 * auVar111._28_4_ | (uint)!bVar17 * auVar110._28_4_;
          bVar17 = (bool)((byte)uVar83 & 1);
          auVar133._0_4_ = (float)((uint)bVar17 * auVar112._0_4_ | (uint)!bVar17 * auVar118._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar17 * auVar112._4_4_ | (uint)!bVar17 * auVar118._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar17 * auVar112._8_4_ | (uint)!bVar17 * auVar118._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar133._12_4_ =
               (float)((uint)bVar17 * auVar112._12_4_ | (uint)!bVar17 * auVar118._12_4_);
          bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar133._16_4_ =
               (float)((uint)bVar17 * auVar112._16_4_ | (uint)!bVar17 * auVar118._16_4_);
          bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar133._20_4_ =
               (float)((uint)bVar17 * auVar112._20_4_ | (uint)!bVar17 * auVar118._20_4_);
          bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar133._24_4_ =
               (float)((uint)bVar17 * auVar112._24_4_ | (uint)!bVar17 * auVar118._24_4_);
          bVar17 = SUB81(uVar83 >> 7,0);
          auVar133._28_4_ = (uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar118._28_4_;
          vandps_avx512vl(auVar119,auVar103);
          vandps_avx512vl(auVar114,auVar103);
          auVar108 = vmaxps_avx(auVar133,auVar133);
          vandps_avx512vl(auVar106,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar133);
          uVar83 = vcmpps_avx512vl(auVar108,local_520,1);
          bVar17 = (bool)((byte)uVar83 & 1);
          auVar134._0_4_ = (uint)bVar17 * auVar111._0_4_ | (uint)!bVar17 * auVar119._0_4_;
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar17 * auVar111._4_4_ | (uint)!bVar17 * auVar119._4_4_;
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar17 * auVar111._8_4_ | (uint)!bVar17 * auVar119._8_4_;
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar17 * auVar111._12_4_ | (uint)!bVar17 * auVar119._12_4_;
          bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar17 * auVar111._16_4_ | (uint)!bVar17 * auVar119._16_4_;
          bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar17 * auVar111._20_4_ | (uint)!bVar17 * auVar119._20_4_;
          bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar17 * auVar111._24_4_ | (uint)!bVar17 * auVar119._24_4_;
          bVar17 = SUB81(uVar83 >> 7,0);
          auVar134._28_4_ = (uint)bVar17 * auVar111._28_4_ | (uint)!bVar17 * auVar119._28_4_;
          bVar17 = (bool)((byte)uVar83 & 1);
          auVar135._0_4_ = (float)((uint)bVar17 * auVar112._0_4_ | (uint)!bVar17 * auVar114._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar17 * auVar112._4_4_ | (uint)!bVar17 * auVar114._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar17 * auVar112._8_4_ | (uint)!bVar17 * auVar114._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar17 * auVar112._12_4_ | (uint)!bVar17 * auVar114._12_4_);
          bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar135._16_4_ =
               (float)((uint)bVar17 * auVar112._16_4_ | (uint)!bVar17 * auVar114._16_4_);
          bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar135._20_4_ =
               (float)((uint)bVar17 * auVar112._20_4_ | (uint)!bVar17 * auVar114._20_4_);
          bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar135._24_4_ =
               (float)((uint)bVar17 * auVar112._24_4_ | (uint)!bVar17 * auVar114._24_4_);
          bVar17 = SUB81(uVar83 >> 7,0);
          auVar135._28_4_ = (uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar114._28_4_;
          auVar217._8_4_ = 0x80000000;
          auVar217._0_8_ = 0x8000000080000000;
          auVar217._12_4_ = 0x80000000;
          auVar217._16_4_ = 0x80000000;
          auVar217._20_4_ = 0x80000000;
          auVar217._24_4_ = 0x80000000;
          auVar217._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar134,auVar217);
          auVar102 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
          auVar106 = vfmadd213ps_avx512vl(auVar132,auVar132,ZEXT1632(auVar102));
          auVar99 = vfmadd231ps_fma(auVar106,auVar133,auVar133);
          auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
          auVar228._8_4_ = 0xbf000000;
          auVar228._0_8_ = 0xbf000000bf000000;
          auVar228._12_4_ = 0xbf000000;
          auVar228._16_4_ = 0xbf000000;
          auVar228._20_4_ = 0xbf000000;
          auVar228._24_4_ = 0xbf000000;
          auVar228._28_4_ = 0xbf000000;
          fVar171 = auVar106._0_4_;
          fVar153 = auVar106._4_4_;
          fVar165 = auVar106._8_4_;
          fVar166 = auVar106._12_4_;
          fVar178 = auVar106._16_4_;
          fVar192 = auVar106._20_4_;
          fVar93 = auVar106._24_4_;
          auVar56._4_4_ = fVar153 * fVar153 * fVar153 * auVar99._4_4_ * -0.5;
          auVar56._0_4_ = fVar171 * fVar171 * fVar171 * auVar99._0_4_ * -0.5;
          auVar56._8_4_ = fVar165 * fVar165 * fVar165 * auVar99._8_4_ * -0.5;
          auVar56._12_4_ = fVar166 * fVar166 * fVar166 * auVar99._12_4_ * -0.5;
          auVar56._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar56._20_4_ = fVar192 * fVar192 * fVar192 * -0.0;
          auVar56._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
          auVar56._28_4_ = auVar133._28_4_;
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar106 = vfmadd231ps_avx512vl(auVar56,auVar119,auVar106);
          auVar57._4_4_ = auVar133._4_4_ * auVar106._4_4_;
          auVar57._0_4_ = auVar133._0_4_ * auVar106._0_4_;
          auVar57._8_4_ = auVar133._8_4_ * auVar106._8_4_;
          auVar57._12_4_ = auVar133._12_4_ * auVar106._12_4_;
          auVar57._16_4_ = auVar133._16_4_ * auVar106._16_4_;
          auVar57._20_4_ = auVar133._20_4_ * auVar106._20_4_;
          auVar57._24_4_ = auVar133._24_4_ * auVar106._24_4_;
          auVar57._28_4_ = 0;
          auVar58._4_4_ = auVar106._4_4_ * -auVar132._4_4_;
          auVar58._0_4_ = auVar106._0_4_ * -auVar132._0_4_;
          auVar58._8_4_ = auVar106._8_4_ * -auVar132._8_4_;
          auVar58._12_4_ = auVar106._12_4_ * -auVar132._12_4_;
          auVar58._16_4_ = auVar106._16_4_ * -auVar132._16_4_;
          auVar58._20_4_ = auVar106._20_4_ * -auVar132._20_4_;
          auVar58._24_4_ = auVar106._24_4_ * -auVar132._24_4_;
          auVar58._28_4_ = auVar133._28_4_;
          auVar118 = vmulps_avx512vl(auVar106,ZEXT1632(auVar102));
          auVar117 = ZEXT1632(auVar102);
          auVar106 = vfmadd213ps_avx512vl(auVar134,auVar134,auVar117);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar135,auVar135);
          auVar110 = vrsqrt14ps_avx512vl(auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar228);
          fVar171 = auVar110._0_4_;
          fVar153 = auVar110._4_4_;
          fVar165 = auVar110._8_4_;
          fVar166 = auVar110._12_4_;
          fVar178 = auVar110._16_4_;
          fVar192 = auVar110._20_4_;
          fVar93 = auVar110._24_4_;
          auVar59._4_4_ = fVar153 * fVar153 * fVar153 * auVar106._4_4_;
          auVar59._0_4_ = fVar171 * fVar171 * fVar171 * auVar106._0_4_;
          auVar59._8_4_ = fVar165 * fVar165 * fVar165 * auVar106._8_4_;
          auVar59._12_4_ = fVar166 * fVar166 * fVar166 * auVar106._12_4_;
          auVar59._16_4_ = fVar178 * fVar178 * fVar178 * auVar106._16_4_;
          auVar59._20_4_ = fVar192 * fVar192 * fVar192 * auVar106._20_4_;
          auVar59._24_4_ = fVar93 * fVar93 * fVar93 * auVar106._24_4_;
          auVar59._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar59,auVar119,auVar110);
          auVar60._4_4_ = auVar135._4_4_ * auVar106._4_4_;
          auVar60._0_4_ = auVar135._0_4_ * auVar106._0_4_;
          auVar60._8_4_ = auVar135._8_4_ * auVar106._8_4_;
          auVar60._12_4_ = auVar135._12_4_ * auVar106._12_4_;
          auVar60._16_4_ = auVar135._16_4_ * auVar106._16_4_;
          auVar60._20_4_ = auVar135._20_4_ * auVar106._20_4_;
          auVar60._24_4_ = auVar135._24_4_ * auVar106._24_4_;
          auVar60._28_4_ = auVar110._28_4_;
          auVar61._4_4_ = auVar106._4_4_ * auVar108._4_4_;
          auVar61._0_4_ = auVar106._0_4_ * auVar108._0_4_;
          auVar61._8_4_ = auVar106._8_4_ * auVar108._8_4_;
          auVar61._12_4_ = auVar106._12_4_ * auVar108._12_4_;
          auVar61._16_4_ = auVar106._16_4_ * auVar108._16_4_;
          auVar61._20_4_ = auVar106._20_4_ * auVar108._20_4_;
          auVar61._24_4_ = auVar106._24_4_ * auVar108._24_4_;
          auVar61._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar106,auVar117);
          auVar99 = vfmadd213ps_fma(auVar57,auVar105,ZEXT1632(auVar100));
          auVar186 = vfmadd213ps_fma(auVar58,auVar105,ZEXT1632(auVar101));
          auVar119 = vfmadd213ps_avx512vl(auVar118,auVar105,auVar107);
          auVar110 = vfmadd213ps_avx512vl(auVar60,auVar113,ZEXT1632(auVar155));
          auVar98 = vfnmadd213ps_fma(auVar57,auVar105,ZEXT1632(auVar100));
          auVar100 = vfmadd213ps_fma(auVar61,auVar113,ZEXT1632(auVar8));
          auVar96 = vfnmadd213ps_fma(auVar58,auVar105,ZEXT1632(auVar101));
          auVar101 = vfmadd213ps_fma(auVar108,auVar113,auVar109);
          auVar30 = vfnmadd231ps_fma(auVar107,auVar105,auVar118);
          auVar214 = vfnmadd213ps_fma(auVar60,auVar113,ZEXT1632(auVar155));
          auVar215 = vfnmadd213ps_fma(auVar61,auVar113,ZEXT1632(auVar8));
          auVar97 = vfnmadd231ps_fma(auVar109,auVar113,auVar108);
          auVar109 = vsubps_avx512vl(auVar110,ZEXT1632(auVar98));
          auVar108 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar96));
          auVar106 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar30));
          auVar62._4_4_ = auVar108._4_4_ * auVar30._4_4_;
          auVar62._0_4_ = auVar108._0_4_ * auVar30._0_4_;
          auVar62._8_4_ = auVar108._8_4_ * auVar30._8_4_;
          auVar62._12_4_ = auVar108._12_4_ * auVar30._12_4_;
          auVar62._16_4_ = auVar108._16_4_ * 0.0;
          auVar62._20_4_ = auVar108._20_4_ * 0.0;
          auVar62._24_4_ = auVar108._24_4_ * 0.0;
          auVar62._28_4_ = auVar118._28_4_;
          auVar155 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar96),auVar106);
          auVar63._4_4_ = auVar106._4_4_ * auVar98._4_4_;
          auVar63._0_4_ = auVar106._0_4_ * auVar98._0_4_;
          auVar63._8_4_ = auVar106._8_4_ * auVar98._8_4_;
          auVar63._12_4_ = auVar106._12_4_ * auVar98._12_4_;
          auVar63._16_4_ = auVar106._16_4_ * 0.0;
          auVar63._20_4_ = auVar106._20_4_ * 0.0;
          auVar63._24_4_ = auVar106._24_4_ * 0.0;
          auVar63._28_4_ = auVar106._28_4_;
          auVar8 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar30),auVar109);
          auVar64._4_4_ = auVar96._4_4_ * auVar109._4_4_;
          auVar64._0_4_ = auVar96._0_4_ * auVar109._0_4_;
          auVar64._8_4_ = auVar96._8_4_ * auVar109._8_4_;
          auVar64._12_4_ = auVar96._12_4_ * auVar109._12_4_;
          auVar64._16_4_ = auVar109._16_4_ * 0.0;
          auVar64._20_4_ = auVar109._20_4_ * 0.0;
          auVar64._24_4_ = auVar109._24_4_ * 0.0;
          auVar64._28_4_ = auVar109._28_4_;
          auVar168 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar98),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar168),auVar117,ZEXT1632(auVar8));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,ZEXT1632(auVar155));
          auVar103 = ZEXT1632(auVar102);
          uVar83 = vcmpps_avx512vl(auVar108,auVar103,2);
          bVar82 = (byte)uVar83;
          fVar145 = (float)((uint)(bVar82 & 1) * auVar99._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar214._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar147 = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar214._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar150 = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar214._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar151 = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar214._12_4_);
          auVar117 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar150,CONCAT44(fVar147,fVar145))));
          fVar146 = (float)((uint)(bVar82 & 1) * auVar186._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar215._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar149 = (float)((uint)bVar17 * auVar186._4_4_ | (uint)!bVar17 * auVar215._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar148 = (float)((uint)bVar17 * auVar186._8_4_ | (uint)!bVar17 * auVar215._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar152 = (float)((uint)bVar17 * auVar186._12_4_ | (uint)!bVar17 * auVar215._12_4_);
          auVar111 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar148,CONCAT44(fVar149,fVar146))));
          auVar136._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar119._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar97._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar17 * auVar119._4_4_ | (uint)!bVar17 * auVar97._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar17 * auVar119._8_4_ | (uint)!bVar17 * auVar97._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar136._12_4_ = (float)((uint)bVar17 * auVar119._12_4_ | (uint)!bVar17 * auVar97._12_4_)
          ;
          fVar153 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_);
          auVar136._16_4_ = fVar153;
          fVar165 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_);
          auVar136._20_4_ = fVar165;
          fVar171 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_);
          auVar136._24_4_ = fVar171;
          iVar1 = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
          auVar136._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar98),auVar110);
          auVar137._0_4_ =
               (uint)(bVar82 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar155._0_4_;
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar155._4_4_;
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar155._8_4_;
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar155._12_4_;
          auVar137._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar108._16_4_;
          auVar137._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar108._20_4_;
          auVar137._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar108._24_4_;
          auVar137._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar100));
          auVar138._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar99._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar99._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar99._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar138._12_4_ = (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar99._12_4_)
          ;
          fVar192 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar108._16_4_);
          auVar138._16_4_ = fVar192;
          fVar178 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar108._20_4_);
          auVar138._20_4_ = fVar178;
          fVar166 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar108._24_4_);
          auVar138._24_4_ = fVar166;
          auVar138._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar101));
          auVar139._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar186._0_4_);
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * auVar186._4_4_);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * auVar186._8_4_);
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * auVar186._12_4_);
          fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar108._16_4_);
          auVar139._16_4_ = fVar177;
          fVar94 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar108._20_4_);
          auVar139._20_4_ = fVar94;
          fVar93 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar108._24_4_);
          auVar139._24_4_ = fVar93;
          iVar2 = (uint)(byte)(uVar83 >> 7) * auVar108._28_4_;
          auVar139._28_4_ = iVar2;
          auVar140._0_4_ =
               (uint)(bVar82 & 1) * (int)auVar98._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar110._0_4_;
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar17 * (int)auVar98._4_4_ | (uint)!bVar17 * auVar110._4_4_;
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar17 * (int)auVar98._8_4_ | (uint)!bVar17 * auVar110._8_4_;
          bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar17 * (int)auVar98._12_4_ | (uint)!bVar17 * auVar110._12_4_;
          auVar140._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar110._16_4_;
          auVar140._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar110._20_4_;
          auVar140._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar110._24_4_;
          auVar140._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar110._28_4_;
          bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar83 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar110 = vsubps_avx512vl(auVar140,auVar117);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar96._12_4_ |
                                                   (uint)!bVar21 * auVar100._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar96._8_4_ |
                                                            (uint)!bVar19 * auVar100._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar96._4_4_ |
                                                                     (uint)!bVar17 * auVar100._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar96._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar100._0_4_)))),auVar111);
          auVar209 = ZEXT3264(auVar106);
          auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar30._12_4_ |
                                                   (uint)!bVar22 * auVar101._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar30._8_4_ |
                                                            (uint)!bVar20 * auVar101._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar30._4_4_ |
                                                                     (uint)!bVar18 * auVar101._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar30._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar101._0_4_)))),auVar136);
          auVar118 = vsubps_avx(auVar117,auVar137);
          auVar213 = ZEXT3264(auVar118);
          auVar109 = vsubps_avx(auVar111,auVar138);
          auVar107 = vsubps_avx(auVar136,auVar139);
          auVar65._4_4_ = auVar119._4_4_ * fVar147;
          auVar65._0_4_ = auVar119._0_4_ * fVar145;
          auVar65._8_4_ = auVar119._8_4_ * fVar150;
          auVar65._12_4_ = auVar119._12_4_ * fVar151;
          auVar65._16_4_ = auVar119._16_4_ * 0.0;
          auVar65._20_4_ = auVar119._20_4_ * 0.0;
          auVar65._24_4_ = auVar119._24_4_ * 0.0;
          auVar65._28_4_ = 0;
          auVar100 = vfmsub231ps_fma(auVar65,auVar136,auVar110);
          auVar190._0_4_ = fVar146 * auVar110._0_4_;
          auVar190._4_4_ = fVar149 * auVar110._4_4_;
          auVar190._8_4_ = fVar148 * auVar110._8_4_;
          auVar190._12_4_ = fVar152 * auVar110._12_4_;
          auVar190._16_4_ = auVar110._16_4_ * 0.0;
          auVar190._20_4_ = auVar110._20_4_ * 0.0;
          auVar190._24_4_ = auVar110._24_4_ * 0.0;
          auVar190._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar190,auVar117,auVar106);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar103,ZEXT1632(auVar100));
          auVar196._0_4_ = auVar106._0_4_ * auVar136._0_4_;
          auVar196._4_4_ = auVar106._4_4_ * auVar136._4_4_;
          auVar196._8_4_ = auVar106._8_4_ * auVar136._8_4_;
          auVar196._12_4_ = auVar106._12_4_ * auVar136._12_4_;
          auVar196._16_4_ = auVar106._16_4_ * fVar153;
          auVar196._20_4_ = auVar106._20_4_ * fVar165;
          auVar196._24_4_ = auVar106._24_4_ * fVar171;
          auVar196._28_4_ = 0;
          auVar100 = vfmsub231ps_fma(auVar196,auVar111,auVar119);
          auVar112 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar100));
          auVar108 = vmulps_avx512vl(auVar107,auVar137);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar118,auVar139);
          auVar66._4_4_ = auVar109._4_4_ * auVar139._4_4_;
          auVar66._0_4_ = auVar109._0_4_ * auVar139._0_4_;
          auVar66._8_4_ = auVar109._8_4_ * auVar139._8_4_;
          auVar66._12_4_ = auVar109._12_4_ * auVar139._12_4_;
          auVar66._16_4_ = auVar109._16_4_ * fVar177;
          auVar66._20_4_ = auVar109._20_4_ * fVar94;
          auVar66._24_4_ = auVar109._24_4_ * fVar93;
          auVar66._28_4_ = iVar2;
          auVar100 = vfmsub231ps_fma(auVar66,auVar138,auVar107);
          auVar197._0_4_ = auVar138._0_4_ * auVar118._0_4_;
          auVar197._4_4_ = auVar138._4_4_ * auVar118._4_4_;
          auVar197._8_4_ = auVar138._8_4_ * auVar118._8_4_;
          auVar197._12_4_ = auVar138._12_4_ * auVar118._12_4_;
          auVar197._16_4_ = fVar192 * auVar118._16_4_;
          auVar197._20_4_ = fVar178 * auVar118._20_4_;
          auVar197._24_4_ = fVar166 * auVar118._24_4_;
          auVar197._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar197,auVar109,auVar137);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar103,auVar108);
          auVar114 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar100));
          auVar200 = ZEXT3264(auVar114);
          auVar108 = vmaxps_avx(auVar112,auVar114);
          uVar25 = vcmpps_avx512vl(auVar108,auVar103,2);
          bVar92 = bVar92 & (byte)uVar25;
          if (bVar92 != 0) {
            uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar229._4_4_ = uVar154;
            auVar229._0_4_ = uVar154;
            auVar229._8_4_ = uVar154;
            auVar229._12_4_ = uVar154;
            auVar229._16_4_ = uVar154;
            auVar229._20_4_ = uVar154;
            auVar229._24_4_ = uVar154;
            auVar229._28_4_ = uVar154;
            auVar230 = ZEXT3264(auVar229);
            auVar67._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar67._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar67._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar67._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar67._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar67._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar67._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar67._28_4_ = auVar108._28_4_;
            auVar8 = vfmsub231ps_fma(auVar67,auVar109,auVar119);
            auVar68._4_4_ = auVar119._4_4_ * auVar118._4_4_;
            auVar68._0_4_ = auVar119._0_4_ * auVar118._0_4_;
            auVar68._8_4_ = auVar119._8_4_ * auVar118._8_4_;
            auVar68._12_4_ = auVar119._12_4_ * auVar118._12_4_;
            auVar68._16_4_ = auVar119._16_4_ * auVar118._16_4_;
            auVar68._20_4_ = auVar119._20_4_ * auVar118._20_4_;
            auVar68._24_4_ = auVar119._24_4_ * auVar118._24_4_;
            auVar68._28_4_ = auVar119._28_4_;
            auVar155 = vfmsub231ps_fma(auVar68,auVar110,auVar107);
            auVar69._4_4_ = auVar109._4_4_ * auVar110._4_4_;
            auVar69._0_4_ = auVar109._0_4_ * auVar110._0_4_;
            auVar69._8_4_ = auVar109._8_4_ * auVar110._8_4_;
            auVar69._12_4_ = auVar109._12_4_ * auVar110._12_4_;
            auVar69._16_4_ = auVar109._16_4_ * auVar110._16_4_;
            auVar69._20_4_ = auVar109._20_4_ * auVar110._20_4_;
            auVar69._24_4_ = auVar109._24_4_ * auVar110._24_4_;
            auVar69._28_4_ = auVar109._28_4_;
            auVar99 = vfmsub231ps_fma(auVar69,auVar118,auVar106);
            auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar155),ZEXT1632(auVar99));
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar8),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar101));
            auVar213 = ZEXT3264(auVar108);
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar35._16_4_ = 0x3f800000;
            auVar35._20_4_ = 0x3f800000;
            auVar35._24_4_ = 0x3f800000;
            auVar35._28_4_ = 0x3f800000;
            auVar106 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar101),auVar35);
            auVar100 = vfmadd132ps_fma(auVar106,auVar108,auVar108);
            auVar209 = ZEXT1664(auVar100);
            auVar70._4_4_ = auVar99._4_4_ * auVar136._4_4_;
            auVar70._0_4_ = auVar99._0_4_ * auVar136._0_4_;
            auVar70._8_4_ = auVar99._8_4_ * auVar136._8_4_;
            auVar70._12_4_ = auVar99._12_4_ * auVar136._12_4_;
            auVar70._16_4_ = fVar153 * 0.0;
            auVar70._20_4_ = fVar165 * 0.0;
            auVar70._24_4_ = fVar171 * 0.0;
            auVar70._28_4_ = iVar1;
            auVar155 = vfmadd231ps_fma(auVar70,auVar111,ZEXT1632(auVar155));
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar117,ZEXT1632(auVar8));
            fVar171 = auVar100._0_4_;
            fVar153 = auVar100._4_4_;
            fVar165 = auVar100._8_4_;
            fVar166 = auVar100._12_4_;
            local_540 = ZEXT1632(CONCAT412(auVar155._12_4_ * fVar166,
                                           CONCAT48(auVar155._8_4_ * fVar165,
                                                    CONCAT44(auVar155._4_4_ * fVar153,
                                                             auVar155._0_4_ * fVar171))));
            auVar219 = ZEXT3264(local_540);
            uVar25 = vcmpps_avx512vl(local_540,auVar229,2);
            auVar81._4_4_ = uStack_4dc;
            auVar81._0_4_ = local_4e0;
            auVar81._8_4_ = uStack_4d8;
            auVar81._12_4_ = uStack_4d4;
            auVar81._16_4_ = uStack_4d0;
            auVar81._20_4_ = uStack_4cc;
            auVar81._24_4_ = uStack_4c8;
            auVar81._28_4_ = uStack_4c4;
            uVar26 = vcmpps_avx512vl(local_540,auVar81,0xd);
            bVar92 = (byte)uVar25 & (byte)uVar26 & bVar92;
            if (bVar92 != 0) {
              uVar87 = vcmpps_avx512vl(ZEXT1632(auVar101),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar87 = bVar92 & uVar87;
              if ((char)uVar87 != '\0') {
                fVar178 = auVar112._0_4_ * fVar171;
                fVar192 = auVar112._4_4_ * fVar153;
                auVar71._4_4_ = fVar192;
                auVar71._0_4_ = fVar178;
                fVar93 = auVar112._8_4_ * fVar165;
                auVar71._8_4_ = fVar93;
                fVar94 = auVar112._12_4_ * fVar166;
                auVar71._12_4_ = fVar94;
                fVar177 = auVar112._16_4_ * 0.0;
                auVar71._16_4_ = fVar177;
                fVar145 = auVar112._20_4_ * 0.0;
                auVar71._20_4_ = fVar145;
                fVar146 = auVar112._24_4_ * 0.0;
                auVar71._24_4_ = fVar146;
                auVar71._28_4_ = auVar112._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar176,auVar71);
                local_3a0._0_4_ =
                     (float)((uint)(bVar82 & 1) * (int)fVar178 |
                            (uint)!(bool)(bVar82 & 1) * auVar108._0_4_);
                bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                local_3a0._4_4_ =
                     (float)((uint)bVar17 * (int)fVar192 | (uint)!bVar17 * auVar108._4_4_);
                bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                local_3a0._8_4_ =
                     (float)((uint)bVar17 * (int)fVar93 | (uint)!bVar17 * auVar108._8_4_);
                bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
                local_3a0._12_4_ =
                     (float)((uint)bVar17 * (int)fVar94 | (uint)!bVar17 * auVar108._12_4_);
                bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
                local_3a0._16_4_ =
                     (float)((uint)bVar17 * (int)fVar177 | (uint)!bVar17 * auVar108._16_4_);
                bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                local_3a0._20_4_ =
                     (float)((uint)bVar17 * (int)fVar145 | (uint)!bVar17 * auVar108._20_4_);
                bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
                local_3a0._24_4_ =
                     (float)((uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar108._24_4_);
                bVar17 = SUB81(uVar83 >> 7,0);
                local_3a0._28_4_ =
                     (float)((uint)bVar17 * auVar112._28_4_ | (uint)!bVar17 * auVar108._28_4_);
                auVar108 = vsubps_avx(auVar113,auVar105);
                auVar100 = vfmadd213ps_fma(auVar108,local_3a0,auVar105);
                uVar154 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar36._4_4_ = uVar154;
                auVar36._0_4_ = uVar154;
                auVar36._8_4_ = uVar154;
                auVar36._12_4_ = uVar154;
                auVar36._16_4_ = uVar154;
                auVar36._20_4_ = uVar154;
                auVar36._24_4_ = uVar154;
                auVar36._28_4_ = uVar154;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                              CONCAT48(auVar100._8_4_ +
                                                                       auVar100._8_4_,
                                                                       CONCAT44(auVar100._4_4_ +
                                                                                auVar100._4_4_,
                                                                                auVar100._0_4_ +
                                                                                auVar100._0_4_)))),
                                           auVar36);
                uVar27 = vcmpps_avx512vl(local_540,auVar108,6);
                uVar87 = uVar87 & uVar27;
                bVar92 = (byte)uVar87;
                if (bVar92 != 0) {
                  auVar170._0_4_ = auVar114._0_4_ * fVar171;
                  auVar170._4_4_ = auVar114._4_4_ * fVar153;
                  auVar170._8_4_ = auVar114._8_4_ * fVar165;
                  auVar170._12_4_ = auVar114._12_4_ * fVar166;
                  auVar170._16_4_ = auVar114._16_4_ * 0.0;
                  auVar170._20_4_ = auVar114._20_4_ * 0.0;
                  auVar170._24_4_ = auVar114._24_4_ * 0.0;
                  auVar170._28_4_ = 0;
                  auVar191._8_4_ = 0x3f800000;
                  auVar191._0_8_ = 0x3f8000003f800000;
                  auVar191._12_4_ = 0x3f800000;
                  auVar191._16_4_ = 0x3f800000;
                  auVar191._20_4_ = 0x3f800000;
                  auVar191._24_4_ = 0x3f800000;
                  auVar191._28_4_ = 0x3f800000;
                  auVar108 = vsubps_avx(auVar191,auVar170);
                  auVar141._0_4_ =
                       (uint)(bVar82 & 1) * (int)auVar170._0_4_ |
                       (uint)!(bool)(bVar82 & 1) * auVar108._0_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar141._4_4_ =
                       (uint)bVar17 * (int)auVar170._4_4_ | (uint)!bVar17 * auVar108._4_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar141._8_4_ =
                       (uint)bVar17 * (int)auVar170._8_4_ | (uint)!bVar17 * auVar108._8_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar141._12_4_ =
                       (uint)bVar17 * (int)auVar170._12_4_ | (uint)!bVar17 * auVar108._12_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar141._16_4_ =
                       (uint)bVar17 * (int)auVar170._16_4_ | (uint)!bVar17 * auVar108._16_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar141._20_4_ =
                       (uint)bVar17 * (int)auVar170._20_4_ | (uint)!bVar17 * auVar108._20_4_;
                  bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar141._24_4_ =
                       (uint)bVar17 * (int)auVar170._24_4_ | (uint)!bVar17 * auVar108._24_4_;
                  auVar141._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar108._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_380 = vfmsub132ps_avx512vl(auVar141,auVar191,auVar37);
                  local_340 = (undefined4)lVar90;
                  pGVar91 = (context->scene->geometries).items[uVar88].ptr;
                  if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar100 = vcvtsi2ss_avx512f(auVar102,local_340);
                    fVar171 = auVar100._0_4_;
                    local_2e0[0] = (fVar171 + local_3a0._0_4_ + 0.0) * (float)local_5a0;
                    local_2e0[1] = (fVar171 + local_3a0._4_4_ + 1.0) * local_5a0._4_4_;
                    local_2e0[2] = (fVar171 + local_3a0._8_4_ + 2.0) * fStack_598;
                    local_2e0[3] = (fVar171 + local_3a0._12_4_ + 3.0) * fStack_594;
                    fStack_2d0 = (fVar171 + local_3a0._16_4_ + 4.0) * fStack_590;
                    fStack_2cc = (fVar171 + local_3a0._20_4_ + 5.0) * fStack_58c;
                    fStack_2c8 = (fVar171 + local_3a0._24_4_ + 6.0) * fStack_588;
                    fStack_2c4 = fVar171 + local_3a0._28_4_ + 7.0;
                    local_2c0 = local_380;
                    local_2a0 = local_540;
                    auVar160._8_4_ = 0x7f800000;
                    auVar160._0_8_ = 0x7f8000007f800000;
                    auVar160._12_4_ = 0x7f800000;
                    auVar160._16_4_ = 0x7f800000;
                    auVar160._20_4_ = 0x7f800000;
                    auVar160._24_4_ = 0x7f800000;
                    auVar160._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar160,local_540);
                    auVar142._0_4_ =
                         (uint)(bVar92 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar142._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar142._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar142._12_4_ = (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar142._16_4_ = (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar142._20_4_ = (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar142._24_4_ = (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar87 >> 7,0);
                    auVar142._28_4_ = (uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar108 = vshufps_avx(auVar142,auVar142,0xb1);
                    auVar108 = vminps_avx(auVar142,auVar108);
                    auVar106 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar106);
                    auVar106 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar106);
                    uVar25 = vcmpps_avx512vl(auVar142,auVar108,0);
                    uVar84 = (uint)uVar87;
                    if (((byte)uVar25 & bVar92) != 0) {
                      uVar84 = (uint)((byte)uVar25 & bVar92);
                    }
                    uVar85 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                      uVar85 = uVar85 + 1;
                    }
                    uVar83 = (ulong)uVar85;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar231._0_32_);
                      local_5c0._0_4_ = iVar86;
                      local_608 = uVar89;
                      local_360 = local_540;
                      local_33c = iVar86;
                      local_330 = auVar95;
                      local_320 = uVar24;
                      uStack_318 = uVar28;
                      local_310 = uVar77;
                      uStack_308 = uVar78;
                      local_300 = uVar79;
                      uStack_2f8 = uVar80;
                      do {
                        fVar171 = local_2e0[uVar83];
                        auVar167._4_4_ = fVar171;
                        auVar167._0_4_ = fVar171;
                        auVar167._8_4_ = fVar171;
                        auVar167._12_4_ = fVar171;
                        local_1e0._16_4_ = fVar171;
                        local_1e0._0_16_ = auVar167;
                        local_1e0._20_4_ = fVar171;
                        local_1e0._24_4_ = fVar171;
                        local_1e0._28_4_ = fVar171;
                        local_1c0 = *(undefined4 *)(local_2c0 + uVar83 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2a0 + uVar83 * 4);
                        local_678.context = context->user;
                        fVar153 = 1.0 - fVar171;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar153 + fVar153))),
                                                  ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
                        auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar167,
                                                   ZEXT416(0xc0a00000));
                        auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                                   ZEXT416((uint)(fVar171 + fVar171)),auVar100);
                        auVar213 = ZEXT1664(auVar101);
                        auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar167,
                                                   ZEXT416(0x40000000));
                        auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * -3.0)),
                                                   ZEXT416((uint)(fVar153 + fVar153)),auVar100);
                        auVar155 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar167,
                                                   ZEXT416((uint)(fVar153 * -2.0)));
                        fVar171 = auVar8._0_4_ * 0.5;
                        fVar153 = auVar101._0_4_ * 0.5;
                        fVar165 = auVar100._0_4_ * 0.5;
                        fVar166 = auVar155._0_4_ * 0.5;
                        auVar184._0_4_ = fVar166 * local_6c0;
                        auVar184._4_4_ = fVar166 * fStack_6bc;
                        auVar184._8_4_ = fVar166 * fStack_6b8;
                        auVar184._12_4_ = fVar166 * fStack_6b4;
                        auVar203._4_4_ = fVar165;
                        auVar203._0_4_ = fVar165;
                        auVar203._8_4_ = fVar165;
                        auVar203._12_4_ = fVar165;
                        auVar100 = vfmadd132ps_fma(auVar203,auVar184,auVar11);
                        auVar185._4_4_ = fVar153;
                        auVar185._0_4_ = fVar153;
                        auVar185._8_4_ = fVar153;
                        auVar185._12_4_ = fVar153;
                        auVar100 = vfmadd132ps_fma(auVar185,auVar100,auVar12);
                        auVar156._4_4_ = fVar171;
                        auVar156._0_4_ = fVar171;
                        auVar156._8_4_ = fVar171;
                        auVar156._12_4_ = fVar171;
                        auVar100 = vfmadd213ps_fma(auVar156,auVar95,auVar100);
                        local_240 = auVar100._0_4_;
                        auVar198._8_4_ = 1;
                        auVar198._0_8_ = 0x100000001;
                        auVar198._12_4_ = 1;
                        auVar198._16_4_ = 1;
                        auVar198._20_4_ = 1;
                        auVar198._24_4_ = 1;
                        auVar198._28_4_ = 1;
                        local_220 = vpermps_avx2(auVar198,ZEXT1632(auVar100));
                        auVar200 = ZEXT3264(local_220);
                        auVar204._8_4_ = 2;
                        auVar204._0_8_ = 0x200000002;
                        auVar204._12_4_ = 2;
                        auVar207._16_4_ = 2;
                        auVar207._0_16_ = auVar204;
                        auVar207._20_4_ = 2;
                        auVar207._24_4_ = 2;
                        auVar207._28_4_ = 2;
                        auVar209 = ZEXT3264(auVar207);
                        local_200 = vpermps_avx2(auVar207,ZEXT1632(auVar100));
                        iStack_23c = local_240;
                        iStack_238 = local_240;
                        iStack_234 = local_240;
                        iStack_230 = local_240;
                        iStack_22c = local_240;
                        iStack_228 = local_240;
                        iStack_224 = local_240;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_4c0._0_8_;
                        uStack_198 = local_4c0._8_8_;
                        uStack_190 = local_4c0._16_8_;
                        uStack_188 = local_4c0._24_8_;
                        local_180 = local_500;
                        auVar108 = vpcmpeqd_avx2(local_500,local_500);
                        local_648[1] = auVar108;
                        *local_648 = auVar108;
                        local_160 = (local_678.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_678.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_640 = local_280;
                        local_678.valid = (int *)local_640;
                        local_678.geometryUserPtr = pGVar91->userPtr;
                        local_678.hit = (RTCHitN *)&local_240;
                        local_678.N = 8;
                        local_5e0 = auVar230._0_32_;
                        local_678.ray = (RTCRayN *)ray;
                        if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar200 = ZEXT1664(local_220._0_16_);
                          auVar209 = ZEXT1664(auVar204);
                          auVar213 = ZEXT1664(auVar101);
                          (*pGVar91->intersectionFilterN)(&local_678);
                          auVar219 = ZEXT3264(local_540);
                          auVar230 = ZEXT3264(local_5e0);
                        }
                        if (local_640 == (undefined1  [32])0x0) {
LAB_01d290ba:
                          *(int *)(ray + k * 4 + 0x100) = auVar230._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar200 = ZEXT1664(auVar200._0_16_);
                            auVar209 = ZEXT1664(auVar209._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            (*p_Var16)(&local_678);
                            auVar219 = ZEXT3264(local_540);
                            auVar230 = ZEXT3264(local_5e0);
                          }
                          if (local_640 == (undefined1  [32])0x0) goto LAB_01d290ba;
                          uVar89 = vptestmd_avx512vl(local_640,local_640);
                          iVar86 = *(int *)(local_678.hit + 4);
                          iVar1 = *(int *)(local_678.hit + 8);
                          iVar2 = *(int *)(local_678.hit + 0xc);
                          iVar72 = *(int *)(local_678.hit + 0x10);
                          iVar73 = *(int *)(local_678.hit + 0x14);
                          iVar74 = *(int *)(local_678.hit + 0x18);
                          iVar75 = *(int *)(local_678.hit + 0x1c);
                          bVar92 = (byte)uVar89;
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                          bVar23 = SUB81(uVar89 >> 7,0);
                          *(uint *)(local_678.ray + 0x180) =
                               (uint)(bVar92 & 1) * *(int *)local_678.hit |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x180);
                          *(uint *)(local_678.ray + 0x184) =
                               (uint)bVar17 * iVar86 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x184);
                          *(uint *)(local_678.ray + 0x188) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x188);
                          *(uint *)(local_678.ray + 0x18c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_678.ray + 0x18c);
                          *(uint *)(local_678.ray + 400) =
                               (uint)bVar20 * iVar72 | (uint)!bVar20 * *(int *)(local_678.ray + 400)
                          ;
                          *(uint *)(local_678.ray + 0x194) =
                               (uint)bVar21 * iVar73 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x194);
                          *(uint *)(local_678.ray + 0x198) =
                               (uint)bVar22 * iVar74 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x198);
                          *(uint *)(local_678.ray + 0x19c) =
                               (uint)bVar23 * iVar75 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x19c);
                          iVar86 = *(int *)(local_678.hit + 0x24);
                          iVar1 = *(int *)(local_678.hit + 0x28);
                          iVar2 = *(int *)(local_678.hit + 0x2c);
                          iVar72 = *(int *)(local_678.hit + 0x30);
                          iVar73 = *(int *)(local_678.hit + 0x34);
                          iVar74 = *(int *)(local_678.hit + 0x38);
                          iVar75 = *(int *)(local_678.hit + 0x3c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                          bVar23 = SUB81(uVar89 >> 7,0);
                          *(uint *)(local_678.ray + 0x1a0) =
                               (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x20) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1a0);
                          *(uint *)(local_678.ray + 0x1a4) =
                               (uint)bVar17 * iVar86 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1a4);
                          *(uint *)(local_678.ray + 0x1a8) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1a8);
                          *(uint *)(local_678.ray + 0x1ac) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_678.ray + 0x1ac);
                          *(uint *)(local_678.ray + 0x1b0) =
                               (uint)bVar20 * iVar72 |
                               (uint)!bVar20 * *(int *)(local_678.ray + 0x1b0);
                          *(uint *)(local_678.ray + 0x1b4) =
                               (uint)bVar21 * iVar73 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x1b4);
                          *(uint *)(local_678.ray + 0x1b8) =
                               (uint)bVar22 * iVar74 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1b8);
                          *(uint *)(local_678.ray + 0x1bc) =
                               (uint)bVar23 * iVar75 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1bc);
                          iVar86 = *(int *)(local_678.hit + 0x44);
                          iVar1 = *(int *)(local_678.hit + 0x48);
                          iVar2 = *(int *)(local_678.hit + 0x4c);
                          iVar72 = *(int *)(local_678.hit + 0x50);
                          iVar73 = *(int *)(local_678.hit + 0x54);
                          iVar74 = *(int *)(local_678.hit + 0x58);
                          iVar75 = *(int *)(local_678.hit + 0x5c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                          bVar23 = SUB81(uVar89 >> 7,0);
                          *(uint *)(local_678.ray + 0x1c0) =
                               (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x40) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1c0);
                          *(uint *)(local_678.ray + 0x1c4) =
                               (uint)bVar17 * iVar86 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1c4);
                          *(uint *)(local_678.ray + 0x1c8) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1c8);
                          *(uint *)(local_678.ray + 0x1cc) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_678.ray + 0x1cc);
                          *(uint *)(local_678.ray + 0x1d0) =
                               (uint)bVar20 * iVar72 |
                               (uint)!bVar20 * *(int *)(local_678.ray + 0x1d0);
                          *(uint *)(local_678.ray + 0x1d4) =
                               (uint)bVar21 * iVar73 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x1d4);
                          *(uint *)(local_678.ray + 0x1d8) =
                               (uint)bVar22 * iVar74 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1d8);
                          *(uint *)(local_678.ray + 0x1dc) =
                               (uint)bVar23 * iVar75 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1dc);
                          iVar86 = *(int *)(local_678.hit + 100);
                          iVar1 = *(int *)(local_678.hit + 0x68);
                          iVar2 = *(int *)(local_678.hit + 0x6c);
                          iVar72 = *(int *)(local_678.hit + 0x70);
                          iVar73 = *(int *)(local_678.hit + 0x74);
                          iVar74 = *(int *)(local_678.hit + 0x78);
                          iVar75 = *(int *)(local_678.hit + 0x7c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                          bVar23 = SUB81(uVar89 >> 7,0);
                          *(uint *)(local_678.ray + 0x1e0) =
                               (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x60) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x1e0);
                          *(uint *)(local_678.ray + 0x1e4) =
                               (uint)bVar17 * iVar86 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1e4);
                          *(uint *)(local_678.ray + 0x1e8) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1e8);
                          *(uint *)(local_678.ray + 0x1ec) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_678.ray + 0x1ec);
                          *(uint *)(local_678.ray + 0x1f0) =
                               (uint)bVar20 * iVar72 |
                               (uint)!bVar20 * *(int *)(local_678.ray + 0x1f0);
                          *(uint *)(local_678.ray + 500) =
                               (uint)bVar21 * iVar73 | (uint)!bVar21 * *(int *)(local_678.ray + 500)
                          ;
                          *(uint *)(local_678.ray + 0x1f8) =
                               (uint)bVar22 * iVar74 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x1f8);
                          *(uint *)(local_678.ray + 0x1fc) =
                               (uint)bVar23 * iVar75 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x1fc);
                          iVar86 = *(int *)(local_678.hit + 0x84);
                          iVar1 = *(int *)(local_678.hit + 0x88);
                          iVar2 = *(int *)(local_678.hit + 0x8c);
                          iVar72 = *(int *)(local_678.hit + 0x90);
                          iVar73 = *(int *)(local_678.hit + 0x94);
                          iVar74 = *(int *)(local_678.hit + 0x98);
                          iVar75 = *(int *)(local_678.hit + 0x9c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                          bVar23 = SUB81(uVar89 >> 7,0);
                          *(uint *)(local_678.ray + 0x200) =
                               (uint)(bVar92 & 1) * *(int *)(local_678.hit + 0x80) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_678.ray + 0x200);
                          *(uint *)(local_678.ray + 0x204) =
                               (uint)bVar17 * iVar86 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x204);
                          *(uint *)(local_678.ray + 0x208) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x208);
                          *(uint *)(local_678.ray + 0x20c) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_678.ray + 0x20c);
                          *(uint *)(local_678.ray + 0x210) =
                               (uint)bVar20 * iVar72 |
                               (uint)!bVar20 * *(int *)(local_678.ray + 0x210);
                          *(uint *)(local_678.ray + 0x214) =
                               (uint)bVar21 * iVar73 |
                               (uint)!bVar21 * *(int *)(local_678.ray + 0x214);
                          *(uint *)(local_678.ray + 0x218) =
                               (uint)bVar22 * iVar74 |
                               (uint)!bVar22 * *(int *)(local_678.ray + 0x218);
                          *(uint *)(local_678.ray + 0x21c) =
                               (uint)bVar23 * iVar75 |
                               (uint)!bVar23 * *(int *)(local_678.ray + 0x21c);
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar108;
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_678.hit + 0x100));
                          *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar108;
                          auVar230 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar92 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar87;
                        uVar154 = auVar230._0_4_;
                        auVar161._4_4_ = uVar154;
                        auVar161._0_4_ = uVar154;
                        auVar161._8_4_ = uVar154;
                        auVar161._12_4_ = uVar154;
                        auVar161._16_4_ = uVar154;
                        auVar161._20_4_ = uVar154;
                        auVar161._24_4_ = uVar154;
                        auVar161._28_4_ = uVar154;
                        uVar25 = vcmpps_avx512vl(auVar219._0_32_,auVar161,2);
                        if ((bVar92 & (byte)uVar25) == 0) goto LAB_01d2914d;
                        bVar92 = bVar92 & (byte)uVar25;
                        uVar87 = (ulong)bVar92;
                        auVar162._8_4_ = 0x7f800000;
                        auVar162._0_8_ = 0x7f8000007f800000;
                        auVar162._12_4_ = 0x7f800000;
                        auVar162._16_4_ = 0x7f800000;
                        auVar162._20_4_ = 0x7f800000;
                        auVar162._24_4_ = 0x7f800000;
                        auVar162._28_4_ = 0x7f800000;
                        auVar108 = vblendmps_avx512vl(auVar162,auVar219._0_32_);
                        auVar143._0_4_ =
                             (uint)(bVar92 & 1) * auVar108._0_4_ |
                             (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 1 & 1);
                        auVar143._4_4_ = (uint)bVar17 * auVar108._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 2 & 1);
                        auVar143._8_4_ = (uint)bVar17 * auVar108._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 3 & 1);
                        auVar143._12_4_ =
                             (uint)bVar17 * auVar108._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 4 & 1);
                        auVar143._16_4_ =
                             (uint)bVar17 * auVar108._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 5 & 1);
                        auVar143._20_4_ =
                             (uint)bVar17 * auVar108._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar92 >> 6 & 1);
                        auVar143._24_4_ =
                             (uint)bVar17 * auVar108._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar143._28_4_ =
                             (uint)(bVar92 >> 7) * auVar108._28_4_ |
                             (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                        auVar108 = vshufps_avx(auVar143,auVar143,0xb1);
                        auVar108 = vminps_avx(auVar143,auVar108);
                        auVar106 = vshufpd_avx(auVar108,auVar108,5);
                        auVar108 = vminps_avx(auVar108,auVar106);
                        auVar106 = vpermpd_avx2(auVar108,0x4e);
                        auVar108 = vminps_avx(auVar108,auVar106);
                        uVar25 = vcmpps_avx512vl(auVar143,auVar108,0);
                        bVar82 = (byte)uVar25 & bVar92;
                        if (bVar82 != 0) {
                          bVar92 = bVar82;
                        }
                        uVar84 = 0;
                        for (uVar85 = (uint)bVar92; (uVar85 & 1) == 0;
                            uVar85 = uVar85 >> 1 | 0x80000000) {
                          uVar84 = uVar84 + 1;
                        }
                        uVar83 = (ulong)uVar84;
                      } while( true );
                    }
                    fVar171 = local_2e0[uVar83];
                    uVar154 = *(undefined4 *)(local_2c0 + uVar83 * 4);
                    fVar153 = 1.0 - fVar171;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar171 * (fVar153 + fVar153))),
                                              ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
                    auVar155 = ZEXT416((uint)fVar171);
                    auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                               ZEXT416(0xc0a00000));
                    auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * 3.0)),
                                               ZEXT416((uint)(fVar171 + fVar171)),auVar100);
                    auVar213 = ZEXT1664(auVar101);
                    auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar155,
                                               ZEXT416(0x40000000));
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * -3.0)),
                                               ZEXT416((uint)(fVar153 + fVar153)),auVar100);
                    auVar155 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),auVar155,
                                               ZEXT416((uint)(fVar153 * -2.0)));
                    fVar153 = auVar8._0_4_ * 0.5;
                    fVar165 = auVar101._0_4_ * 0.5;
                    auVar200 = ZEXT464((uint)fVar165);
                    fVar166 = auVar100._0_4_ * 0.5;
                    fVar178 = auVar155._0_4_ * 0.5;
                    auVar182._0_4_ = fVar178 * local_6c0;
                    auVar182._4_4_ = fVar178 * fStack_6bc;
                    auVar182._8_4_ = fVar178 * fStack_6b8;
                    auVar182._12_4_ = fVar178 * fStack_6b4;
                    auVar202._4_4_ = fVar166;
                    auVar202._0_4_ = fVar166;
                    auVar202._8_4_ = fVar166;
                    auVar202._12_4_ = fVar166;
                    auVar100 = vfmadd132ps_fma(auVar202,auVar182,auVar9);
                    auVar209 = ZEXT1664(auVar100);
                    auVar183._4_4_ = fVar165;
                    auVar183._0_4_ = fVar165;
                    auVar183._8_4_ = fVar165;
                    auVar183._12_4_ = fVar165;
                    auVar100 = vfmadd132ps_fma(auVar183,auVar100,auVar10);
                    auVar173._4_4_ = fVar153;
                    auVar173._0_4_ = fVar153;
                    auVar173._8_4_ = fVar153;
                    auVar173._12_4_ = fVar153;
                    auVar100 = vfmadd213ps_fma(auVar173,auVar95,auVar100);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar83 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar100._0_4_;
                    uVar15 = vextractps_avx(auVar100,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                    uVar15 = vextractps_avx(auVar100,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar171;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar154;
                    *(uint *)(ray + k * 4 + 0x220) = uVar14;
                    *(uint *)(ray + k * 4 + 0x240) = uVar88;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d28d40;
      }
LAB_01d283ac:
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar154;
      auVar34._0_4_ = uVar154;
      auVar34._8_4_ = uVar154;
      auVar34._12_4_ = uVar154;
      auVar34._16_4_ = uVar154;
      auVar34._20_4_ = uVar154;
      auVar34._24_4_ = uVar154;
      auVar34._28_4_ = uVar154;
      uVar24 = vcmpps_avx512vl(local_80,auVar34,2);
      uVar88 = (uint)uVar89 & (uint)uVar24;
      uVar89 = (ulong)uVar88;
    } while (uVar88 != 0);
  }
  return;
LAB_01d2914d:
  auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar233 = ZEXT1664(auVar100);
  auVar232 = ZEXT3264(local_560);
  auVar234 = ZEXT3264(local_580);
  auVar108 = vmovdqa64_avx512vl(local_120);
  auVar231 = ZEXT3264(auVar108);
  uVar89 = local_608;
  iVar86 = local_5c0._0_4_;
LAB_01d28d40:
  lVar90 = lVar90 + 8;
  if (iVar86 <= (int)lVar90) goto LAB_01d283ac;
  goto LAB_01d28451;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }